

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QGate1.cpp
# Opt level: O3

void test_qclab_qgates_QGate1<std::complex<double>>(void)

{
  double *pdVar1;
  double dVar2;
  void *pvVar3;
  tuple<std::complex<double>_*,_std::default_delete<std::complex<double>[]>_> tVar4;
  tuple<std::complex<double>_*,_std::default_delete<std::complex<double>[]>_> tVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar6;
  undefined8 *puVar7;
  long lVar8;
  char *pcVar9;
  char *pcVar10;
  undefined *puVar11;
  undefined8 *puVar12;
  size_type *psVar13;
  pointer *__ptr_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar14;
  __uniq_ptr_data<std::complex<double>,_std::default_delete<std::complex<double>[]>,_true,_true>
  _Var15;
  _Head_base<0UL,_std::complex<double>_*,_false> _Var16;
  tuple<std::complex<double>_*,_std::default_delete<std::complex<double>[]>_> tVar17;
  _Head_base<0UL,_std::complex<double>_*,_false> _Var18;
  string *psVar19;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar20;
  pointer pcVar21;
  AssertHelperData *pAVar22;
  AssertHelperData *pAVar23;
  allocator_type aVar24;
  allocator_type aVar25;
  long lVar26;
  char *in_R9;
  _Alloc_hider _Var27;
  pointer pcVar28;
  vector<std::complex<double>,std::allocator<std::complex<double>>> vVar29;
  undefined1 uVar30;
  undefined1 uVar31;
  pointer *__ptr;
  pointer *__ptr_6;
  byte bVar32;
  initializer_list<std::complex<double>_> __l;
  initializer_list<std::complex<double>_> __l_00;
  initializer_list<std::complex<double>_> __l_01;
  initializer_list<std::complex<double>_> __l_02;
  initializer_list<std::complex<double>_> __l_03;
  initializer_list<std::complex<double>_> __l_04;
  initializer_list<std::complex<double>_> __l_05;
  initializer_list<std::complex<double>_> __l_06;
  initializer_list<std::complex<double>_> __l_07;
  V vec3;
  V check3;
  V check2;
  V vec1;
  V check3_1;
  V vec2;
  V check1;
  V v3;
  V v2;
  V v1;
  undefined1 local_1f8 [8];
  _Head_base<0UL,_std::complex<double>_*,_false> local_1f0;
  pointer local_1e8;
  undefined1 local_1e0 [8];
  _Head_base<0UL,_std::complex<double>_*,_false> local_1d8;
  pointer local_1d0;
  undefined1 local_1c8 [8];
  _Head_base<0UL,_std::complex<double>_*,_false> local_1c0;
  pointer local_1b8;
  undefined1 local_1b0 [32];
  vector<std::complex<double>,_std::allocator<std::complex<double>_>_> local_190;
  undefined1 local_178 [8];
  _Head_base<0UL,_std::complex<double>_*,_false> local_170;
  pointer local_168;
  AssertHelper local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_158;
  AssertHelper local_150;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_148;
  vector<std::complex<double>,_std::allocator<std::complex<double>_>_> local_140;
  string local_128;
  undefined1 *local_108;
  undefined8 uStack_100;
  undefined1 *local_f8;
  undefined8 uStack_f0;
  undefined1 local_a8 [8];
  SquareMatrix<std::complex<double>_> local_a0;
  SquareMatrix<std::complex<double>_> local_90;
  vector<std::complex<double>,_std::allocator<std::complex<double>_>_> local_80;
  SquareMatrix<std::complex<double>_> local_68;
  vector<std::complex<double>,_std::allocator<std::complex<double>_>_> local_58;
  vector<std::complex<double>,_std::allocator<std::complex<double>_>_> local_40;
  
  bVar32 = 0;
  qclab::dense::eye<std::complex<double>>((int64_t)&local_a0);
  qclab::dense::eye<std::complex<double>>((int64_t)&local_90);
  qclab::dense::eye<std::complex<double>>((int64_t)&local_68);
  local_128.field_2._M_allocated_capacity = (size_type)&DAT_4014000000000000;
  local_128.field_2._8_8_ = 0;
  local_128._M_dataplus._M_p = &DAT_4008000000000000;
  local_128._M_string_length = 0;
  __l._M_len = 2;
  __l._M_array = (iterator)&local_128;
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::vector
            (&local_40,__l,(allocator_type *)local_1b0);
  local_f8 = &DAT_401c000000000000;
  uStack_f0 = 0;
  local_108 = (undefined1 *)0x4000000000000000;
  uStack_100 = 0;
  local_128.field_2._M_allocated_capacity = (size_type)&DAT_4014000000000000;
  local_128.field_2._8_8_ = 0;
  local_128._M_dataplus._M_p = &DAT_4008000000000000;
  local_128._M_string_length = 0;
  __l_00._M_len = 4;
  __l_00._M_array = (iterator)&local_128;
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::vector
            (&local_58,__l_00,(allocator_type *)local_1b0);
  puVar7 = &DAT_00428b38;
  psVar19 = &local_128;
  for (lVar8 = 0x10; lVar8 != 0; lVar8 = lVar8 + -1) {
    (psVar19->_M_dataplus)._M_p = (pointer)*puVar7;
    puVar7 = puVar7 + (ulong)bVar32 * -2 + 1;
    psVar19 = (string *)((long)psVar19 + (ulong)bVar32 * -0x10 + 8);
  }
  __l_01._M_len = 8;
  __l_01._M_array = (iterator)&local_128;
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::vector
            (&local_80,__l_01,(allocator_type *)local_1b0);
  local_190.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl
  .super__Vector_impl_data._M_finish =
       (pointer)((ulong)local_190.
                        super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish._4_4_ << 0x20);
  local_190.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)&PTR_nbQubits_004e8e78;
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::vector
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_1b0,
             &local_40);
  qclab::qgates::PauliX<std::complex<double>_>::apply
            ((PauliX<std::complex<double>_> *)&local_190,NoTrans,1,
             (vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_1b0,0);
  local_128.field_2._M_allocated_capacity = (size_type)&DAT_4008000000000000;
  local_128.field_2._8_8_ = 0;
  local_128._M_dataplus._M_p = &DAT_4014000000000000;
  local_128._M_string_length = 0;
  __l_02._M_len = 2;
  __l_02._M_array = (iterator)&local_128;
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::vector
            (&local_140,__l_02,(allocator_type *)local_178);
  if (local_1b0._8_8_ - local_1b0._0_8_ ==
      (long)local_140.
            super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl
            .super__Vector_impl_data._M_finish -
      (long)local_140.
            super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl
            .super__Vector_impl_data._M_start) {
    if (local_1b0._0_8_ != local_1b0._8_8_) {
      lVar8 = 0;
      do {
        if ((((*(double *)(local_1b0._0_8_ + lVar8) !=
               *(double *)
                ((local_140.
                  super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
                  _M_impl.super__Vector_impl_data._M_start)->_M_value + lVar8)) ||
             (NAN(*(double *)(local_1b0._0_8_ + lVar8)) ||
              NAN(*(double *)
                   ((local_140.
                     super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->_M_value + lVar8)))) ||
            (*(double *)(local_1b0._0_8_ + lVar8 + 8) !=
             *(double *)
              ((local_140.
                super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
                _M_impl.super__Vector_impl_data._M_start)->_M_value + lVar8 + 8))) ||
           (NAN(*(double *)(local_1b0._0_8_ + lVar8 + 8)) ||
            NAN(*(double *)
                 ((local_140.
                   super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
                   _M_impl.super__Vector_impl_data._M_start)->_M_value + lVar8 + 8))))
        goto LAB_0019fae5;
        lVar26 = lVar8 + 0x10;
        lVar8 = lVar8 + 0x10;
      } while ((pointer)(local_1b0._0_8_ + lVar26) != (pointer)local_1b0._8_8_);
    }
  }
  else {
LAB_0019fae5:
    local_178[0] = (allocator_type)0x0;
    local_170._M_head_impl = (complex<double> *)0x0;
    testing::Message::Message((Message *)local_1c8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_128,(internal *)local_178,(AssertionResult *)"vec1 == check1","false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_1f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/QGate1.cpp"
               ,0x1d,local_128._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_1f8,(Message *)local_1c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_1f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_dataplus._M_p != &local_128.field_2) {
      operator_delete(local_128._M_dataplus._M_p,
                      (ulong)(local_128.field_2._M_allocated_capacity + 1));
    }
    if ((long *)CONCAT71(local_1c8._1_7_,local_1c8[0]) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_1c8._1_7_,local_1c8[0]) + 8))();
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_170._M_head_impl
        != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_178 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_170._M_head_impl);
    }
  }
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::vector
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_178,
             &local_58);
  qclab::qgates::PauliX<std::complex<double>_>::apply
            ((PauliX<std::complex<double>_> *)&local_190,NoTrans,2,
             (vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_178,0);
  local_f8 = &DAT_4014000000000000;
  uStack_f0 = 0;
  local_108 = &DAT_4008000000000000;
  uStack_100 = 0;
  local_128.field_2._M_allocated_capacity = (size_type)&DAT_401c000000000000;
  local_128.field_2._8_8_ = 0;
  local_128._M_dataplus._M_p = &DAT_4000000000000000;
  local_128._M_string_length = 0;
  __l_03._M_len = 4;
  __l_03._M_array = (iterator)&local_128;
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::vector
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_1c8,
             __l_03,(allocator_type *)local_1f8);
  pbVar6 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           CONCAT71(local_178._1_7_,local_178[0]);
  lVar8 = CONCAT71(local_1c8._1_7_,local_1c8[0]);
  if ((long)local_170._M_head_impl - (long)pbVar6 == (long)local_1c0._M_head_impl - lVar8) {
    if (pbVar6 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  local_170._M_head_impl) {
      lVar26 = 0;
      do {
        dVar2 = *(double *)((long)&(pbVar6->_M_dataplus)._M_p + lVar26);
        if (((dVar2 != *(double *)(lVar8 + lVar26)) ||
            (NAN(dVar2) || NAN(*(double *)(lVar8 + lVar26)))) ||
           ((dVar2 = *(double *)((long)&pbVar6->_M_string_length + lVar26),
            pdVar1 = (double *)(lVar8 + 8 + lVar26), dVar2 != *pdVar1 ||
            (NAN(dVar2) || NAN(*pdVar1))))) goto LAB_0019fc8b;
        pbVar14 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  ((pbVar6->field_2)._M_local_buf + lVar26);
        lVar26 = lVar26 + 0x10;
      } while (pbVar14 !=
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               local_170._M_head_impl);
    }
  }
  else {
LAB_0019fc8b:
    local_1f8 = (undefined1  [8])((ulong)local_1f8 & 0xffffffffffffff00);
    local_1f0._M_head_impl = (complex<double> *)0x0;
    testing::Message::Message((Message *)local_1e0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_128,(internal *)local_1f8,(AssertionResult *)"vec2 == check2","false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_160,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/QGate1.cpp"
               ,0x29,local_128._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_160,(Message *)local_1e0);
    testing::internal::AssertHelper::~AssertHelper(&local_160);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_dataplus._M_p != &local_128.field_2) {
      operator_delete(local_128._M_dataplus._M_p,
                      (ulong)(local_128.field_2._M_allocated_capacity + 1));
    }
    if ((long *)CONCAT71(local_1e0._1_7_,local_1e0[0]) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_1e0._1_7_,local_1e0[0]) + 8))();
    }
    if ((AssertHelperData *)local_1f0._M_head_impl != (AssertHelperData *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_1f0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_1f0._M_head_impl);
    }
  }
  local_190.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl
  .super__Vector_impl_data._M_finish =
       (pointer)CONCAT44(local_190.
                         super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish._4_4_,1);
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::operator=
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_178,
             &local_58);
  qclab::qgates::PauliX<std::complex<double>_>::apply
            ((PauliX<std::complex<double>_> *)&local_190,NoTrans,2,
             (vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_178,0);
  local_f8 = (undefined1 *)0x4000000000000000;
  uStack_f0 = 0;
  local_108 = &DAT_401c000000000000;
  uStack_100 = 0;
  local_128.field_2._M_allocated_capacity = (size_type)&DAT_4008000000000000;
  local_128.field_2._8_8_ = 0;
  local_128._M_dataplus._M_p = &DAT_4014000000000000;
  local_128._M_string_length = 0;
  std::vector<std::complex<double>,std::allocator<std::complex<double>>>::
  _M_assign_aux<std::complex<double>const*>
            ((vector<std::complex<double>,std::allocator<std::complex<double>>> *)local_1c8,
             &local_128);
  pbVar6 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           CONCAT71(local_178._1_7_,local_178[0]);
  lVar8 = CONCAT71(local_1c8._1_7_,local_1c8[0]);
  if ((long)local_170._M_head_impl - (long)pbVar6 == (long)local_1c0._M_head_impl - lVar8) {
    if (pbVar6 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  local_170._M_head_impl) {
      lVar26 = 0;
      do {
        dVar2 = *(double *)((long)&(pbVar6->_M_dataplus)._M_p + lVar26);
        if (((dVar2 != *(double *)(lVar8 + lVar26)) ||
            (NAN(dVar2) || NAN(*(double *)(lVar8 + lVar26)))) ||
           ((dVar2 = *(double *)((long)&pbVar6->_M_string_length + lVar26),
            pdVar1 = (double *)(lVar8 + 8 + lVar26), dVar2 != *pdVar1 ||
            (NAN(dVar2) || NAN(*pdVar1))))) goto LAB_0019fe3e;
        pbVar14 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  ((pbVar6->field_2)._M_local_buf + lVar26);
        lVar26 = lVar26 + 0x10;
      } while (pbVar14 !=
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               local_170._M_head_impl);
    }
  }
  else {
LAB_0019fe3e:
    local_1f8 = (undefined1  [8])((ulong)local_1f8 & 0xffffffffffffff00);
    local_1f0._M_head_impl = (complex<double> *)0x0;
    testing::Message::Message((Message *)local_1e0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_128,(internal *)local_1f8,(AssertionResult *)"vec2 == check2","false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_160,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/QGate1.cpp"
               ,0x35,local_128._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_160,(Message *)local_1e0);
    testing::internal::AssertHelper::~AssertHelper(&local_160);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_dataplus._M_p != &local_128.field_2) {
      operator_delete(local_128._M_dataplus._M_p,
                      (ulong)(local_128.field_2._M_allocated_capacity + 1));
    }
    if ((long *)CONCAT71(local_1e0._1_7_,local_1e0[0]) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_1e0._1_7_,local_1e0[0]) + 8))();
    }
    if ((_Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>)
        local_1f0._M_head_impl != (complex<double> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_1f0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_1f0._M_head_impl);
    }
  }
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::vector
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_1f8,
             &local_80);
  qclab::qgates::PauliX<std::complex<double>_>::apply
            ((PauliX<std::complex<double>_> *)&local_190,NoTrans,3,
             (vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_1f8,0);
  puVar7 = &DAT_00428c38;
  psVar19 = &local_128;
  for (lVar8 = 0x10; lVar8 != 0; lVar8 = lVar8 + -1) {
    (psVar19->_M_dataplus)._M_p = (pointer)*puVar7;
    puVar7 = puVar7 + (ulong)bVar32 * -2 + 1;
    psVar19 = (string *)((long)psVar19 + (ulong)bVar32 * -0x10 + 8);
  }
  __l_04._M_len = 8;
  __l_04._M_array = (iterator)&local_128;
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::vector
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_1e0,
             __l_04,(allocator_type *)&local_160);
  lVar8 = CONCAT71(local_1e0._1_7_,local_1e0[0]);
  if ((long)local_1f0._M_head_impl - (long)local_1f8 == (long)local_1d8._M_head_impl - lVar8) {
    if (local_1f8 != (undefined1  [8])local_1f0._M_head_impl) {
      lVar26 = 0;
      do {
        dVar2 = *(double *)((long)&((_Alloc_hider *)local_1f8)->_M_p + lVar26);
        if ((((dVar2 != *(double *)(lVar8 + lVar26)) ||
             (NAN(dVar2) || NAN(*(double *)(lVar8 + lVar26)))) ||
            (dVar2 = *(double *)((long)((long)local_1f8 + 8) + lVar26),
            pdVar1 = (double *)(lVar8 + 8 + lVar26), dVar2 != *pdVar1)) ||
           (NAN(dVar2) || NAN(*pdVar1))) goto LAB_0019ffc4;
        _Var15.
        super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>.
        _M_t.
        super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
        .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl =
             (__uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>)
             ((long)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)((long)local_1f8 + 0x10))->_M_local_buf + lVar26);
        lVar26 = lVar26 + 0x10;
      } while (_Var15.
               super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
               ._M_t.
               super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
               .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl !=
               (__uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>)
               local_1f0._M_head_impl);
    }
  }
  else {
LAB_0019ffc4:
    local_160.data_._0_1_ = (allocator_type)0x0;
    local_158 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    testing::Message::Message((Message *)&local_148);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_128,(internal *)&local_160,(AssertionResult *)"vec3 == check3","false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_150,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/QGate1.cpp"
               ,0x41,local_128._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_150,(Message *)&local_148);
    testing::internal::AssertHelper::~AssertHelper(&local_150);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_dataplus._M_p != &local_128.field_2) {
      operator_delete(local_128._M_dataplus._M_p,
                      (ulong)(local_128.field_2._M_allocated_capacity + 1));
    }
    if (local_148._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_148._M_head_impl + 8))();
    }
    if (local_158 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_158,local_158);
    }
  }
  local_190.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl
  .super__Vector_impl_data._M_finish =
       (pointer)((ulong)local_190.
                        super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish & 0xffffffff00000000);
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::operator=
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_1f8,
             &local_80);
  qclab::qgates::PauliX<std::complex<double>_>::apply
            ((PauliX<std::complex<double>_> *)&local_190,NoTrans,3,
             (vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_1f8,0);
  puVar7 = &DAT_00428cb8;
  psVar19 = &local_128;
  for (lVar8 = 0x10; lVar8 != 0; lVar8 = lVar8 + -1) {
    (psVar19->_M_dataplus)._M_p = (pointer)*puVar7;
    puVar7 = puVar7 + (ulong)bVar32 * -2 + 1;
    psVar19 = (string *)((long)psVar19 + ((ulong)bVar32 * -2 + 1) * 8);
  }
  std::vector<std::complex<double>,std::allocator<std::complex<double>>>::
  _M_assign_aux<std::complex<double>const*>
            ((vector<std::complex<double>,std::allocator<std::complex<double>>> *)local_1e0,
             &local_128,local_a8);
  lVar8 = CONCAT71(local_1e0._1_7_,local_1e0[0]);
  if ((long)local_1f0._M_head_impl - (long)local_1f8 == (long)local_1d8._M_head_impl - lVar8) {
    if (local_1f8 != (undefined1  [8])local_1f0._M_head_impl) {
      lVar26 = 0;
      do {
        dVar2 = *(double *)((long)&((_Alloc_hider *)local_1f8)->_M_p + lVar26);
        if (((dVar2 != *(double *)(lVar8 + lVar26)) ||
            (NAN(dVar2) || NAN(*(double *)(lVar8 + lVar26)))) ||
           ((dVar2 = *(double *)((long)((_Alloc_hider *)local_1f8 + 1) + lVar26),
            pdVar1 = (double *)(lVar8 + 8 + lVar26), dVar2 != *pdVar1 ||
            (NAN(dVar2) || NAN(*pdVar1))))) goto LAB_001a0161;
        _Var16._M_head_impl =
             (complex<double> *)
             (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)((long)local_1f8 + 0x10))->_M_local_buf + lVar26);
        lVar26 = lVar26 + 0x10;
      } while (_Var16._M_head_impl != local_1f0._M_head_impl);
    }
  }
  else {
LAB_001a0161:
    local_160.data_._0_1_ = (allocator_type)0x0;
    local_158 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    testing::Message::Message((Message *)&local_148);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_128,(internal *)&local_160,(AssertionResult *)"vec3 == check3","false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_150,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/QGate1.cpp"
               ,0x4d,local_128._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_150,(Message *)&local_148);
    testing::internal::AssertHelper::~AssertHelper(&local_150);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_dataplus._M_p != &local_128.field_2) {
      operator_delete(local_128._M_dataplus._M_p,
                      (ulong)(local_128.field_2._M_allocated_capacity + 1));
    }
    if (local_148._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_148._M_head_impl + 8))();
    }
    if (local_158 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_158,local_158);
    }
  }
  local_190.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl
  .super__Vector_impl_data._M_finish =
       (pointer)CONCAT44(local_190.
                         super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish._4_4_,2);
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::operator=
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_1f8,
             &local_80);
  qclab::qgates::PauliX<std::complex<double>_>::apply
            ((PauliX<std::complex<double>_> *)&local_190,NoTrans,3,
             (vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_1f8,0);
  puVar7 = &DAT_00428d38;
  psVar19 = &local_128;
  for (lVar8 = 0x10; lVar8 != 0; lVar8 = lVar8 + -1) {
    (psVar19->_M_dataplus)._M_p = (pointer)*puVar7;
    puVar7 = puVar7 + (ulong)bVar32 * -2 + 1;
    psVar19 = (string *)((long)psVar19 + ((ulong)bVar32 * -2 + 1) * 8);
  }
  std::vector<std::complex<double>,std::allocator<std::complex<double>>>::
  _M_assign_aux<std::complex<double>const*>
            ((vector<std::complex<double>,std::allocator<std::complex<double>>> *)local_1e0,
             &local_128,local_a8);
  lVar8 = CONCAT71(local_1e0._1_7_,local_1e0[0]);
  if ((long)local_1f0._M_head_impl - (long)local_1f8 == (long)local_1d8._M_head_impl - lVar8) {
    if (local_1f8 != (undefined1  [8])local_1f0._M_head_impl) {
      lVar26 = 0;
      do {
        dVar2 = *(double *)((long)&((_Alloc_hider *)local_1f8)->_M_p + lVar26);
        if (((dVar2 != *(double *)(lVar8 + lVar26)) ||
            (NAN(dVar2) || NAN(*(double *)(lVar8 + lVar26)))) ||
           ((dVar2 = *(double *)((long)((long)local_1f8 + 8) + lVar26),
            pdVar1 = (double *)(lVar8 + 8 + lVar26), dVar2 != *pdVar1 ||
            (NAN(dVar2) || NAN(*pdVar1))))) goto LAB_001a02fe;
        tVar17.
        super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
        .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl =
             (_Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
             )((long)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)((long)local_1f8 + 0x10))->_M_local_buf + lVar26);
        lVar26 = lVar26 + 0x10;
      } while (tVar17.
               super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
               .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl !=
               (_Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                )local_1f0._M_head_impl);
    }
  }
  else {
LAB_001a02fe:
    local_160.data_._0_1_ = (allocator_type)0x0;
    local_158 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    testing::Message::Message((Message *)&local_148);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_128,(internal *)&local_160,(AssertionResult *)"vec3 == check3","false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_150,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/QGate1.cpp"
               ,0x59,local_128._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_150,(Message *)&local_148);
    testing::internal::AssertHelper::~AssertHelper(&local_150);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_dataplus._M_p != &local_128.field_2) {
      operator_delete(local_128._M_dataplus._M_p,
                      (ulong)(local_128.field_2._M_allocated_capacity + 1));
    }
    if (local_148._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_148._M_head_impl + 8))();
    }
    if (local_158 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_158,local_158);
    }
  }
  pvVar3 = (void *)CONCAT71(local_1e0._1_7_,local_1e0[0]);
  if (pvVar3 != (void *)0x0) {
    operator_delete(pvVar3,(long)local_1d0 - (long)pvVar3);
  }
  if (local_1f8 != (undefined1  [8])0x0) {
    operator_delete((void *)local_1f8,(long)local_1e8 - (long)local_1f8);
  }
  pvVar3 = (void *)CONCAT71(local_1c8._1_7_,local_1c8[0]);
  if (pvVar3 != (void *)0x0) {
    operator_delete(pvVar3,(long)local_1b8 - (long)pvVar3);
  }
  pvVar3 = (void *)CONCAT71(local_178._1_7_,local_178[0]);
  if (pvVar3 != (void *)0x0) {
    operator_delete(pvVar3,(long)local_168 - (long)pvVar3);
  }
  if (local_140.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_140.
                    super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_140.
                          super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_140.
                          super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((pointer)local_1b0._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_1b0._0_8_,
                    CONCAT44(local_1b0._20_4_,local_1b0._16_4_) - local_1b0._0_8_);
  }
  local_1b0._8_8_ = (ulong)(uint3)local_1b0._13_3_ << 0x28;
  local_1b0._16_4_ = 0;
  local_1b0._20_4_ = 0;
  local_1b0._24_4_ = 0;
  local_1b0._28_4_ = 0x3ff00000;
  local_1b0._0_8_ = &PTR_nbQubits_004ea318;
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::vector
            (&local_140,&local_40);
  qclab::qgates::RotationY<std::complex<double>_>::apply
            ((RotationY<std::complex<double>_> *)local_1b0,Trans,1,&local_140,0);
  local_128.field_2._M_allocated_capacity = 0xc008000000000000;
  local_128.field_2._8_8_ = 0;
  local_128._M_dataplus._M_p = &DAT_4014000000000000;
  local_128._M_string_length = 0;
  __l_05._M_len = 2;
  __l_05._M_array = (iterator)&local_128;
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::vector
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_178,
             __l_05,(allocator_type *)local_1c8);
  lVar8 = CONCAT71(local_178._1_7_,local_178[0]);
  if ((long)local_140.
            super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl
            .super__Vector_impl_data._M_finish -
      (long)local_140.
            super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl
            .super__Vector_impl_data._M_start == (long)local_170._M_head_impl - lVar8) {
    if (local_140.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
        _M_impl.super__Vector_impl_data._M_start !=
        local_140.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      lVar26 = 0;
      do {
        if ((((*(double *)
                ((local_140.
                  super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
                  _M_impl.super__Vector_impl_data._M_start)->_M_value + lVar26) !=
               *(double *)(lVar8 + lVar26)) ||
             (NAN(*(double *)
                   ((local_140.
                     super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->_M_value + lVar26)) ||
              NAN(*(double *)(lVar8 + lVar26)))) ||
            (pdVar1 = (double *)(lVar8 + 8 + lVar26),
            *(double *)
             ((local_140.
               super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
               _M_impl.super__Vector_impl_data._M_start)->_M_value + lVar26 + 8) != *pdVar1)) ||
           (NAN(*(double *)
                 ((local_140.
                   super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
                   _M_impl.super__Vector_impl_data._M_start)->_M_value + lVar26 + 8)) ||
            NAN(*pdVar1))) goto LAB_001a0571;
        _Var15.
        super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>.
        _M_t.
        super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
        .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl =
             (__uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>)
             ((long)local_140.
                    super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[1]._M_value + lVar26);
        lVar26 = lVar26 + 0x10;
      } while (_Var15.
               super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
               ._M_t.
               super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
               .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl !=
               (__uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>)
               local_140.
               super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
               _M_impl.super__Vector_impl_data._M_finish);
    }
  }
  else {
LAB_001a0571:
    local_1c8[0] = (vector<std::complex<double>,std::allocator<std::complex<double>>>)0x0;
    local_1c0._M_head_impl = (complex<double> *)0x0;
    testing::Message::Message((Message *)local_1f8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_128,(internal *)local_1c8,(AssertionResult *)"vec1 == check1","false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_1e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/QGate1.cpp"
               ,0x6a,local_128._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_1e0,(Message *)local_1f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_1e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_dataplus._M_p != &local_128.field_2) {
      operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
    }
    if (local_1f8 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_1f8 + 8))();
    }
    if (local_1c0._M_head_impl != (complex<double> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_1c0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_1c0._M_head_impl);
    }
  }
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::vector
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_1c8,
             &local_58);
  qclab::qgates::RotationY<std::complex<double>_>::apply
            ((RotationY<std::complex<double>_> *)local_1b0,Trans,2,
             (vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_1c8,0);
  local_f8 = (undefined1 *)0xc014000000000000;
  uStack_f0 = 0;
  local_108 = (undefined1 *)0xc008000000000000;
  uStack_100 = 0;
  local_128.field_2._M_allocated_capacity = (size_type)&DAT_401c000000000000;
  local_128.field_2._8_8_ = 0;
  local_128._M_dataplus._M_p = &DAT_4000000000000000;
  local_128._M_string_length = 0;
  __l_06._M_len = 4;
  __l_06._M_array = (iterator)&local_128;
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::vector
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_1f8,
             __l_06,(allocator_type *)local_1e0);
  _Var16._M_head_impl._1_7_ = local_1c8._1_7_;
  _Var16._M_head_impl._0_1_ = local_1c8[0];
  if ((long)local_1c0._M_head_impl - (long)_Var16._M_head_impl ==
      (long)local_1f0._M_head_impl - (long)local_1f8) {
    if (_Var16._M_head_impl != local_1c0._M_head_impl) {
      lVar8 = 0;
      do {
        dVar2 = *(double *)((long)&((_Alloc_hider *)(_Var16._M_head_impl)->_M_value)->_M_p + lVar8);
        pdVar1 = (double *)((long)&((_Alloc_hider *)local_1f8)->_M_p + lVar8);
        if (((dVar2 != *pdVar1) || (NAN(dVar2) || NAN(*pdVar1))) ||
           ((dVar2 = *(double *)
                      ((long)((_Alloc_hider *)(_Var16._M_head_impl)->_M_value + 1) + lVar8),
            pdVar1 = (double *)((long)((long)local_1f8 + 8) + lVar8), dVar2 != *pdVar1 ||
            (NAN(dVar2) || NAN(*pdVar1))))) goto LAB_001a0702;
        _Var18._M_head_impl =
             (complex<double> *)
             (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(_Var16._M_head_impl + 1))->_M_local_buf + lVar8);
        lVar8 = lVar8 + 0x10;
      } while (_Var18._M_head_impl != local_1c0._M_head_impl);
    }
  }
  else {
LAB_001a0702:
    local_1e0[0] = (vector<std::complex<double>,std::allocator<std::complex<double>>>)0x0;
    local_1d8._M_head_impl = (complex<double> *)0x0;
    testing::Message::Message((Message *)&local_190);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_128,(internal *)local_1e0,(AssertionResult *)"vec2 == check2","false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_160,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/QGate1.cpp"
               ,0x76,local_128._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_160,(Message *)&local_190);
    testing::internal::AssertHelper::~AssertHelper(&local_160);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_dataplus._M_p != &local_128.field_2) {
      operator_delete(local_128._M_dataplus._M_p,
                      (ulong)(local_128.field_2._M_allocated_capacity + 1));
    }
    if (local_190.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      (**(code **)(*(undefined **)
                    (local_190.
                     super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->_M_value + 8))();
    }
    if ((_Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>)
        local_1d8._M_head_impl != (complex<double> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_1d8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_1d8._M_head_impl);
    }
  }
  local_1b0._8_4_ = 1;
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::operator=
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_1c8,
             &local_58);
  qclab::qgates::RotationY<std::complex<double>_>::apply
            ((RotationY<std::complex<double>_> *)local_1b0,Trans,2,
             (vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_1c8,0);
  local_f8 = (undefined1 *)0xc000000000000000;
  uStack_f0 = 0;
  local_108 = &DAT_401c000000000000;
  uStack_100 = 0;
  local_128.field_2._M_allocated_capacity = 0xc008000000000000;
  local_128.field_2._8_8_ = 0;
  local_128._M_dataplus._M_p = &DAT_4014000000000000;
  local_128._M_string_length = 0;
  std::vector<std::complex<double>,std::allocator<std::complex<double>>>::
  _M_assign_aux<std::complex<double>const*>
            ((vector<std::complex<double>,std::allocator<std::complex<double>>> *)local_1f8,
             &local_128);
  tVar17.
  super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>.
  super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl._1_7_ = local_1c8._1_7_;
  tVar17.
  super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>.
  super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl._0_1_ = local_1c8[0];
  if ((long)local_1c0._M_head_impl -
      (long)tVar17.
            super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
            .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl ==
      (long)local_1f0._M_head_impl - (long)local_1f8) {
    if (tVar17.
        super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
        .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl !=
        (_Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>)
        local_1c0._M_head_impl) {
      lVar8 = 0;
      do {
        pdVar1 = (double *)((long)&((_Alloc_hider *)local_1f8)->_M_p + lVar8);
        if (((*(double *)
               ((long)tVar17.
                      super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                      .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl + lVar8) !=
              *pdVar1) ||
            (NAN(*(double *)
                  ((long)tVar17.
                         super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                         .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl + lVar8)
                ) || NAN(*pdVar1))) ||
           ((dVar2 = *(double *)
                      ((long)((long)tVar17.
                                    super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                    .super__Head_base<0UL,_std::complex<double>_*,_false>.
                                    _M_head_impl + 8) + lVar8),
            pdVar1 = (double *)((long)((long)local_1f8 + 8) + lVar8), dVar2 != *pdVar1 ||
            (NAN(dVar2) || NAN(*pdVar1))))) goto LAB_001a08a8;
        lVar26 = (long)tVar17.
                       super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                       .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl + lVar8;
        lVar8 = lVar8 + 0x10;
      } while ((complex<double> *)(lVar26 + 0x10) != local_1c0._M_head_impl);
    }
  }
  else {
LAB_001a08a8:
    local_1e0[0] = (vector<std::complex<double>,std::allocator<std::complex<double>>>)0x0;
    local_1d8._M_head_impl = (complex<double> *)0x0;
    testing::Message::Message((Message *)&local_190);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_128,(internal *)local_1e0,(AssertionResult *)"vec2 == check2","false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_160,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/QGate1.cpp"
               ,0x82,local_128._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_160,(Message *)&local_190);
    testing::internal::AssertHelper::~AssertHelper(&local_160);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_dataplus._M_p != &local_128.field_2) {
      operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
    }
    if (local_190.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      (**(code **)(*(undefined **)
                    (local_190.
                     super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->_M_value + 8))();
    }
    if ((_Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>)
        local_1d8._M_head_impl != (complex<double> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_1d8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_1d8._M_head_impl);
    }
  }
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::vector
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_1e0,
             &local_80);
  qclab::qgates::RotationY<std::complex<double>_>::apply
            ((RotationY<std::complex<double>_> *)local_1b0,Trans,3,
             (vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_1e0,0);
  puVar7 = &DAT_00428e38;
  psVar19 = &local_128;
  for (lVar8 = 0x10; lVar8 != 0; lVar8 = lVar8 + -1) {
    (psVar19->_M_dataplus)._M_p = (pointer)*puVar7;
    puVar7 = puVar7 + (ulong)bVar32 * -2 + 1;
    psVar19 = (string *)((long)psVar19 + (ulong)bVar32 * -0x10 + 8);
  }
  __l_07._M_len = 8;
  __l_07._M_array = (iterator)&local_128;
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::vector
            (&local_190,__l_07,(allocator_type *)&local_160);
  tVar4.super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
  .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl._1_7_ = local_1e0._1_7_;
  tVar4.super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
  .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl._0_1_ = local_1e0[0];
  if ((long)local_1d8._M_head_impl -
      (long)tVar4.
            super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
            .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl ==
      (long)local_190.
            super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl
            .super__Vector_impl_data._M_finish -
      (long)local_190.
            super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl
            .super__Vector_impl_data._M_start) {
    if (tVar4.
        super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
        .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl !=
        (_Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>)
        local_1d8._M_head_impl) {
      lVar8 = 0;
      do {
        pdVar1 = (double *)
                 ((long)(local_190.
                         super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->_M_value + lVar8);
        if ((((*(double *)
                ((long)tVar4.
                       super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                       .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl + lVar8)
               != *pdVar1) ||
             (NAN(*(double *)
                   ((long)tVar4.
                          super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                          .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl + lVar8
                   )) || NAN(*pdVar1))) ||
            (dVar2 = *(double *)
                      ((long)((long)tVar4.
                                    super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                    .super__Head_base<0UL,_std::complex<double>_*,_false>.
                                    _M_head_impl + 8) + lVar8),
            pdVar1 = (double *)
                     ((long)(local_190.
                             super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->_M_value + lVar8 + 8),
            dVar2 != *pdVar1)) || (NAN(dVar2) || NAN(*pdVar1))) goto LAB_001a0a35;
        lVar26 = (long)tVar4.
                       super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                       .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl + lVar8;
        lVar8 = lVar8 + 0x10;
      } while ((complex<double> *)(lVar26 + 0x10) != local_1d8._M_head_impl);
    }
  }
  else {
LAB_001a0a35:
    local_160.data_._0_1_ = (allocator_type)0x0;
    local_158 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    testing::Message::Message((Message *)&local_148);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_128,(internal *)&local_160,(AssertionResult *)"vec3 == check3","false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_150,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/QGate1.cpp"
               ,0x8e,local_128._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_150,(Message *)&local_148);
    testing::internal::AssertHelper::~AssertHelper(&local_150);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_dataplus._M_p != &local_128.field_2) {
      operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
    }
    if (local_148._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_148._M_head_impl + 8))();
    }
    if (local_158 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_158,local_158);
    }
  }
  local_1b0._8_8_ = local_1b0._8_8_ & 0xffffffff00000000;
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::operator=
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_1e0,
             &local_80);
  qclab::qgates::RotationY<std::complex<double>_>::apply
            ((RotationY<std::complex<double>_> *)local_1b0,Trans,3,
             (vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_1e0,0);
  puVar7 = &DAT_00428eb8;
  psVar19 = &local_128;
  for (lVar8 = 0x10; lVar8 != 0; lVar8 = lVar8 + -1) {
    (psVar19->_M_dataplus)._M_p = (pointer)*puVar7;
    puVar7 = puVar7 + (ulong)bVar32 * -2 + 1;
    psVar19 = (string *)((long)psVar19 + ((ulong)bVar32 * -2 + 1) * 8);
  }
  std::vector<std::complex<double>,std::allocator<std::complex<double>>>::
  _M_assign_aux<std::complex<double>const*>
            ((vector<std::complex<double>,std::allocator<std::complex<double>>> *)&local_190,
             &local_128,local_a8);
  _Var18._M_head_impl._1_7_ = local_1e0._1_7_;
  _Var18._M_head_impl._0_1_ = local_1e0[0];
  if ((long)local_1d8._M_head_impl - (long)_Var18._M_head_impl ==
      (long)local_190.
            super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl
            .super__Vector_impl_data._M_finish -
      (long)local_190.
            super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl
            .super__Vector_impl_data._M_start) {
    if (_Var18._M_head_impl != local_1d8._M_head_impl) {
      lVar8 = 0;
      do {
        dVar2 = *(double *)((long)&((_Alloc_hider *)(_Var18._M_head_impl)->_M_value)->_M_p + lVar8);
        pdVar1 = (double *)
                 ((long)(local_190.
                         super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->_M_value + lVar8);
        if (((dVar2 != *pdVar1) || (NAN(dVar2) || NAN(*pdVar1))) ||
           ((dVar2 = *(double *)
                      ((long)((_Alloc_hider *)(_Var18._M_head_impl)->_M_value + 1) + lVar8),
            pdVar1 = (double *)
                     ((long)(local_190.
                             super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->_M_value + lVar8 + 8),
            dVar2 != *pdVar1 || (NAN(dVar2) || NAN(*pdVar1))))) goto LAB_001a0bd7;
        _Var16._M_head_impl =
             (complex<double> *)
             (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(_Var18._M_head_impl + 1))->_M_local_buf + lVar8);
        lVar8 = lVar8 + 0x10;
      } while (_Var16._M_head_impl != local_1d8._M_head_impl);
    }
  }
  else {
LAB_001a0bd7:
    local_160.data_._0_1_ = (allocator_type)0x0;
    local_158 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    testing::Message::Message((Message *)&local_148);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_128,(internal *)&local_160,(AssertionResult *)"vec3 == check3","false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_150,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/QGate1.cpp"
               ,0x9a,local_128._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_150,(Message *)&local_148);
    testing::internal::AssertHelper::~AssertHelper(&local_150);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_dataplus._M_p != &local_128.field_2) {
      operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
    }
    if (local_148._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_148._M_head_impl + 8))();
    }
    if (local_158 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_158,local_158);
    }
  }
  local_1b0._8_4_ = 2;
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::operator=
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_1e0,
             &local_80);
  qclab::qgates::RotationY<std::complex<double>_>::apply
            ((RotationY<std::complex<double>_> *)local_1b0,Trans,3,
             (vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_1e0,0);
  puVar7 = &DAT_00428f38;
  psVar19 = &local_128;
  for (lVar8 = 0x10; lVar8 != 0; lVar8 = lVar8 + -1) {
    (psVar19->_M_dataplus)._M_p = (pointer)*puVar7;
    puVar7 = puVar7 + (ulong)bVar32 * -2 + 1;
    psVar19 = (string *)((long)psVar19 + ((ulong)bVar32 * -2 + 1) * 8);
  }
  std::vector<std::complex<double>,std::allocator<std::complex<double>>>::
  _M_assign_aux<std::complex<double>const*>
            ((vector<std::complex<double>,std::allocator<std::complex<double>>> *)&local_190,
             &local_128,local_a8);
  tVar5.super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
  .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl._1_7_ = local_1e0._1_7_;
  tVar5.super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
  .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl._0_1_ = local_1e0[0];
  if ((long)local_1d8._M_head_impl -
      (long)tVar5.
            super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
            .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl ==
      (long)local_190.
            super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl
            .super__Vector_impl_data._M_finish -
      (long)local_190.
            super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl
            .super__Vector_impl_data._M_start) {
    if (tVar5.
        super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
        .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl !=
        (_Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>)
        local_1d8._M_head_impl) {
      lVar8 = 0;
      do {
        pdVar1 = (double *)
                 ((long)(local_190.
                         super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->_M_value + lVar8);
        if (((*(double *)
               ((long)tVar5.
                      super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                      .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl + lVar8) !=
              *pdVar1) ||
            (NAN(*(double *)
                  ((long)tVar5.
                         super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                         .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl + lVar8)
                ) || NAN(*pdVar1))) ||
           ((dVar2 = *(double *)
                      ((long)((long)tVar5.
                                    super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                    .super__Head_base<0UL,_std::complex<double>_*,_false>.
                                    _M_head_impl + 8) + lVar8),
            pdVar1 = (double *)
                     ((long)(local_190.
                             super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->_M_value + lVar8 + 8),
            dVar2 != *pdVar1 || (NAN(dVar2) || NAN(*pdVar1))))) goto LAB_001a0d79;
        lVar26 = (long)tVar5.
                       super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                       .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl + lVar8;
        lVar8 = lVar8 + 0x10;
      } while ((complex<double> *)(lVar26 + 0x10) != local_1d8._M_head_impl);
    }
  }
  else {
LAB_001a0d79:
    local_160.data_._0_1_ = (allocator_type)0x0;
    local_158 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    testing::Message::Message((Message *)&local_148);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_128,(internal *)&local_160,(AssertionResult *)"vec3 == check3","false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_150,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/QGate1.cpp"
               ,0xa6,local_128._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_150,(Message *)&local_148);
    testing::internal::AssertHelper::~AssertHelper(&local_150);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_dataplus._M_p != &local_128.field_2) {
      operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
    }
    if (local_148._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_148._M_head_impl + 8))();
    }
    if (local_158 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_158,local_158);
    }
  }
  if (local_190.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_190.
                    super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_190.
                          super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_190.
                          super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  pvVar3 = (void *)CONCAT71(local_1e0._1_7_,local_1e0[0]);
  if (pvVar3 != (void *)0x0) {
    operator_delete(pvVar3,(long)local_1d0 - (long)pvVar3);
  }
  if (local_1f8 != (undefined1  [8])0x0) {
    operator_delete((void *)local_1f8,(long)local_1e8 - (long)local_1f8);
  }
  pvVar3 = (void *)CONCAT71(local_1c8._1_7_,local_1c8[0]);
  if (pvVar3 != (void *)0x0) {
    operator_delete(pvVar3,(long)local_1b8 - (long)pvVar3);
  }
  pvVar3 = (void *)CONCAT71(local_178._1_7_,local_178[0]);
  if (pvVar3 != (void *)0x0) {
    operator_delete(pvVar3,(long)local_168 - (long)pvVar3);
  }
  if (local_140.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_140.
                    super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_140.
                          super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_140.
                          super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  local_1b0._8_8_ = local_1b0._8_8_ & 0xffffffff00000000;
  local_1b0._0_8_ = &PTR_nbQubits_004e8e78;
  qclab::dense::SquareMatrix<std::complex<double>_>::SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)&local_140,&local_a0);
  pcVar10 = (char *)0x0;
  qclab::qgates::PauliX<std::complex<double>_>::apply
            ((PauliX<std::complex<double>_> *)local_1b0,Left,NoTrans,1,
             (SquareMatrix<std::complex<double>_> *)&local_140,0);
  puVar7 = (undefined8 *)operator_new__(0x40);
  *puVar7 = 0;
  puVar7[1] = 0;
  puVar7[2] = 0x3ff0000000000000;
  puVar7[3] = 0;
  puVar7[4] = 0x3ff0000000000000;
  puVar7[5] = 0;
  puVar7[6] = 0;
  puVar7[7] = 0;
  if (local_140.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
      _M_impl.super__Vector_impl_data._M_start == (pointer)0x2) {
    pcVar9 = (char *)((long)local_140.
                            super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish + 8);
    puVar12 = puVar7 + 1;
    lVar8 = 0;
    do {
      lVar26 = 0;
      do {
        dVar2 = *(double *)((long)puVar12 + lVar26 + -8);
        local_178[0] = (allocator_type)0x0;
        if ((((dVar2 != *(double *)(pcVar9 + lVar26 + -8)) ||
             (NAN(dVar2) || NAN(*(double *)(pcVar9 + lVar26 + -8)))) ||
            (*(double *)((long)puVar12 + lVar26) != *(double *)(pcVar9 + lVar26))) ||
           (NAN(*(double *)((long)puVar12 + lVar26)) || NAN(*(double *)(pcVar9 + lVar26))))
        goto LAB_001a0fd2;
        lVar26 = lVar26 + 0x10;
      } while (lVar26 != 0x20);
      lVar8 = lVar8 + 1;
      pcVar9 = pcVar9 + 0x20;
      puVar12 = puVar12 + 4;
      local_178[0] = (allocator_type)0x1;
    } while (lVar8 != 2);
  }
  else {
    local_178[0] = (allocator_type)0x0;
  }
LAB_001a0fd2:
  local_170._M_head_impl = (complex<double> *)0x0;
  operator_delete__(puVar7);
  if (local_178[0] == (allocator_type)0x0) {
    testing::Message::Message((Message *)local_1c8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_128,(internal *)local_178,(AssertionResult *)"mat1 == X.matrix()","false",
               "true",pcVar10);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_1f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/QGate1.cpp"
               ,0xb7,local_128._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_1f8,(Message *)local_1c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_1f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_dataplus._M_p != &local_128.field_2) {
      operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
    }
    if ((long *)CONCAT71(local_1c8._1_7_,local_1c8[0]) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_1c8._1_7_,local_1c8[0]) + 8))();
    }
  }
  if ((_Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>)
      local_170._M_head_impl != (complex<double> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_178 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_170._M_head_impl);
  }
  local_128._M_dataplus._M_p = (pointer)0x2;
  local_128._M_string_length = (size_type)operator_new__(0x40);
  *(undefined8 *)local_128._M_string_length = 0x4000000000000000;
  *(undefined8 *)(local_128._M_string_length + 8) = 0;
  *(undefined1 **)(local_128._M_string_length + 0x10) = &DAT_4014000000000000;
  *(undefined8 *)(local_128._M_string_length + 0x18) = 0;
  *(undefined1 **)(local_128._M_string_length + 0x20) = &DAT_4008000000000000;
  *(undefined8 *)(local_128._M_string_length + 0x28) = 0;
  *(undefined1 **)(local_128._M_string_length + 0x30) = &DAT_401c000000000000;
  *(undefined8 *)(local_128._M_string_length + 0x38) = 0;
  qclab::dense::SquareMatrix<std::complex<double>_>::operator=
            ((SquareMatrix<std::complex<double>_> *)&local_140,
             (SquareMatrix<std::complex<double>_> *)&local_128);
  if ((undefined8 *)local_128._M_string_length != (undefined8 *)0x0) {
    operator_delete__((void *)local_128._M_string_length);
  }
  pcVar10 = (char *)0x0;
  qclab::qgates::PauliX<std::complex<double>_>::apply
            ((PauliX<std::complex<double>_> *)local_1b0,Left,NoTrans,1,
             (SquareMatrix<std::complex<double>_> *)&local_140,0);
  puVar7 = (undefined8 *)operator_new__(0x40);
  *puVar7 = &DAT_4008000000000000;
  puVar7[1] = 0;
  puVar7[2] = &DAT_401c000000000000;
  puVar7[3] = 0;
  puVar7[4] = 0x4000000000000000;
  puVar7[5] = 0;
  puVar7[6] = &DAT_4014000000000000;
  puVar7[7] = 0;
  if (local_140.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
      _M_impl.super__Vector_impl_data._M_start == (pointer)0x2) {
    pcVar9 = (local_140.
              super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
              _M_impl.super__Vector_impl_data._M_finish)->_M_value + 8;
    puVar12 = puVar7 + 1;
    lVar8 = 0;
    do {
      lVar26 = 0;
      do {
        dVar2 = *(double *)((long)puVar12 + lVar26 + -8);
        if (((dVar2 != *(double *)(pcVar9 + lVar26 + -8)) ||
            (NAN(dVar2) || NAN(*(double *)(pcVar9 + lVar26 + -8)))) ||
           ((*(double *)((long)puVar12 + lVar26) != *(double *)(pcVar9 + lVar26) ||
            (NAN(*(double *)((long)puVar12 + lVar26)) || NAN(*(double *)(pcVar9 + lVar26))))))
        goto LAB_001a11da;
        lVar26 = lVar26 + 0x10;
      } while (lVar26 != 0x20);
      lVar8 = lVar8 + 1;
      pcVar9 = pcVar9 + 0x20;
      puVar12 = puVar12 + 4;
    } while (lVar8 != 2);
  }
  else {
LAB_001a11da:
    local_178[0] = (allocator_type)0x0;
    local_170._M_head_impl = (complex<double> *)0x0;
    testing::Message::Message((Message *)local_1c8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_128,(internal *)local_178,(AssertionResult *)"mat1 == check1","false","true",
               pcVar10);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_1f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/QGate1.cpp"
               ,0xbd,local_128._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_1f8,(Message *)local_1c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_1f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_dataplus._M_p != &local_128.field_2) {
      operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
    }
    if ((long *)CONCAT71(local_1c8._1_7_,local_1c8[0]) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_1c8._1_7_,local_1c8[0]) + 8))();
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_170._M_head_impl
        != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_178 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_170._M_head_impl);
    }
  }
  qclab::dense::SquareMatrix<std::complex<double>_>::SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)local_178,&local_90);
  _Var27._M_p = (pointer)0x0;
  qclab::qgates::PauliX<std::complex<double>_>::apply
            ((PauliX<std::complex<double>_> *)local_1b0,Left,NoTrans,2,
             (SquareMatrix<std::complex<double>_> *)local_178,0);
  local_1f8 = (undefined1  [8])0x2;
  local_1f0._M_head_impl = (complex<double> *)operator_new__(0x40);
  *(undefined8 *)(local_1f0._M_head_impl)->_M_value = 0;
  *(undefined8 *)((long)(local_1f0._M_head_impl)->_M_value + 8) = 0;
  *(undefined8 *)local_1f0._M_head_impl[1]._M_value = 0x3ff0000000000000;
  *(undefined8 *)(local_1f0._M_head_impl[1]._M_value + 8) = 0;
  *(undefined8 *)local_1f0._M_head_impl[2]._M_value = 0x3ff0000000000000;
  *(undefined8 *)(local_1f0._M_head_impl[2]._M_value + 8) = 0;
  *(undefined8 *)local_1f0._M_head_impl[3]._M_value = 0;
  *(undefined8 *)(local_1f0._M_head_impl[3]._M_value + 8) = 0;
  qclab::dense::kron<std::complex<double>>
            ((dense *)&local_128,(SquareMatrix<std::complex<double>_> *)local_1f8,&local_a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128._M_dataplus._M_p ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_178._1_7_,local_178[0])) {
    if (0 < (long)local_128._M_dataplus._M_p) {
      psVar13 = (size_type *)((long)local_170._M_head_impl + 8);
      puVar12 = (undefined8 *)(local_128._M_string_length + 8);
      paVar20 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x0;
      vVar29 = (vector<std::complex<double>,std::allocator<std::complex<double>>>)0x0;
      do {
        lVar8 = 0;
        _Var27._M_p = local_128._M_dataplus._M_p;
        do {
          dVar2 = *(double *)((long)puVar12 + lVar8 + -8);
          pdVar1 = (double *)((long)psVar13 + lVar8 + -8);
          local_1c8[0] = vVar29;
          if (((dVar2 != *pdVar1) || (NAN(dVar2) || NAN(*pdVar1))) ||
             ((*(double *)((long)puVar12 + lVar8) != *(double *)((long)psVar13 + lVar8) ||
              (local_1c8[0] = (vector<std::complex<double>,std::allocator<std::complex<double>>>)0x0
              , NAN(*(double *)((long)puVar12 + lVar8)) || NAN(*(double *)((long)psVar13 + lVar8))))
             )) goto LAB_001a13ac;
          lVar8 = lVar8 + 0x10;
          _Var27._M_p = _Var27._M_p + -1;
        } while ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)_Var27._M_p !=
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)0x0);
        paVar20 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(paVar20->_M_local_buf + 1);
        psVar13 = psVar13 + (long)local_128._M_dataplus._M_p * 2;
        puVar12 = puVar12 + (long)local_128._M_dataplus._M_p * 2;
      } while (paVar20 !=
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_128._M_dataplus._M_p);
    }
    local_1c8[0] = (vector<std::complex<double>,std::allocator<std::complex<double>>>)0x1;
  }
  else {
    local_1c8[0] = (vector<std::complex<double>,std::allocator<std::complex<double>>>)0x0;
  }
LAB_001a13ac:
  local_1c0._M_head_impl = (complex<double> *)0x0;
  if ((undefined8 *)local_128._M_string_length != (undefined8 *)0x0) {
    operator_delete__((void *)local_128._M_string_length);
  }
  local_128._M_string_length = 0;
  if (local_1f0._M_head_impl != (complex<double> *)0x0) {
    operator_delete__(local_1f0._M_head_impl);
  }
  if (local_1c8[0] == (vector<std::complex<double>,std::allocator<std::complex<double>>>)0x0) {
    testing::Message::Message((Message *)local_1f8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_128,(internal *)local_1c8,
               (AssertionResult *)"mat2 == qclab::dense::kron( X.matrix() , I1 )","false","true",
               _Var27._M_p);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_1e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/QGate1.cpp"
               ,0xc2,local_128._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_1e0,(Message *)local_1f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_1e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_dataplus._M_p != &local_128.field_2) {
      operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
    }
    if (local_1f8 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_1f8 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c0._M_head_impl !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_1c0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_1c0._M_head_impl);
  }
  local_1b0._8_4_ = 1;
  qclab::dense::SquareMatrix<std::complex<double>_>::operator=
            ((SquareMatrix<std::complex<double>_> *)local_178,&local_90);
  _Var27._M_p = (pointer)0x0;
  qclab::qgates::PauliX<std::complex<double>_>::apply
            ((PauliX<std::complex<double>_> *)local_1b0,Left,NoTrans,2,
             (SquareMatrix<std::complex<double>_> *)local_178,0);
  local_1f8 = (undefined1  [8])0x2;
  local_1f0._M_head_impl = (complex<double> *)operator_new__(0x40);
  *(undefined8 *)(local_1f0._M_head_impl)->_M_value = 0;
  *(undefined8 *)((long)(local_1f0._M_head_impl)->_M_value + 8) = 0;
  *(undefined8 *)local_1f0._M_head_impl[1]._M_value = 0x3ff0000000000000;
  *(undefined8 *)(local_1f0._M_head_impl[1]._M_value + 8) = 0;
  *(undefined8 *)local_1f0._M_head_impl[2]._M_value = 0x3ff0000000000000;
  *(undefined8 *)(local_1f0._M_head_impl[2]._M_value + 8) = 0;
  *(undefined8 *)local_1f0._M_head_impl[3]._M_value = 0;
  *(undefined8 *)(local_1f0._M_head_impl[3]._M_value + 8) = 0;
  qclab::dense::kron<std::complex<double>>
            ((dense *)&local_128,&local_a0,(SquareMatrix<std::complex<double>_> *)local_1f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128._M_dataplus._M_p ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_178._1_7_,local_178[0])) {
    if (0 < (long)local_128._M_dataplus._M_p) {
      psVar13 = (size_type *)((_Alloc_hider *)(local_170._M_head_impl)->_M_value + 1);
      lVar8 = local_128._M_string_length + 8;
      paVar20 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x0;
      vVar29 = (vector<std::complex<double>,std::allocator<std::complex<double>>>)0x0;
      do {
        lVar26 = 0;
        _Var27._M_p = local_128._M_dataplus._M_p;
        do {
          dVar2 = *(double *)(lVar8 + lVar26 + -8);
          pdVar1 = (double *)((long)psVar13 + lVar26 + -8);
          local_1c8[0] = vVar29;
          if ((((dVar2 != *pdVar1) || (NAN(dVar2) || NAN(*pdVar1))) ||
              (*(double *)(lVar8 + lVar26) != *(double *)((long)psVar13 + lVar26))) ||
             (local_1c8[0] = (vector<std::complex<double>,std::allocator<std::complex<double>>>)0x0,
             NAN(*(double *)(lVar8 + lVar26)) || NAN(*(double *)((long)psVar13 + lVar26))))
          goto LAB_001a15b8;
          lVar26 = lVar26 + 0x10;
          _Var27._M_p = _Var27._M_p + -1;
        } while ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)_Var27._M_p !=
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)0x0);
        paVar20 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(paVar20->_M_local_buf + 1);
        psVar13 = psVar13 + (long)local_128._M_dataplus._M_p * 2;
        lVar8 = lVar8 + (long)local_128._M_dataplus._M_p * 0x10;
      } while (paVar20 !=
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_128._M_dataplus._M_p);
    }
    local_1c8[0] = (vector<std::complex<double>,std::allocator<std::complex<double>>>)0x1;
  }
  else {
    local_1c8[0] = (vector<std::complex<double>,std::allocator<std::complex<double>>>)0x0;
  }
LAB_001a15b8:
  local_1c0._M_head_impl = (complex<double> *)0x0;
  if ((void *)local_128._M_string_length != (void *)0x0) {
    operator_delete__((void *)local_128._M_string_length);
  }
  local_128._M_string_length = 0;
  if (local_1f0._M_head_impl != (complex<double> *)0x0) {
    operator_delete__(local_1f0._M_head_impl);
  }
  if (local_1c8[0] == (vector<std::complex<double>,std::allocator<std::complex<double>>>)0x0) {
    testing::Message::Message((Message *)local_1f8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_128,(internal *)local_1c8,
               (AssertionResult *)"mat2 == qclab::dense::kron( I1 , X.matrix() )","false","true",
               _Var27._M_p);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_1e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/QGate1.cpp"
               ,199,local_128._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_1e0,(Message *)local_1f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_1e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_dataplus._M_p != &local_128.field_2) {
      operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
    }
    if (local_1f8 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_1f8 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c0._M_head_impl !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_1c0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_1c0._M_head_impl);
  }
  qclab::dense::SquareMatrix<std::complex<double>_>::SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)local_1c8,&local_68);
  _Var27._M_p = (pointer)0x0;
  qclab::qgates::PauliX<std::complex<double>_>::apply
            ((PauliX<std::complex<double>_> *)local_1b0,Left,NoTrans,3,
             (SquareMatrix<std::complex<double>_> *)local_1c8,0);
  local_190.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x2;
  local_190.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)operator_new__(0x40);
  *(undefined8 *)
   (local_190.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
    _M_impl.super__Vector_impl_data._M_finish)->_M_value = 0;
  *(undefined8 *)
   ((long)(local_190.
           super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl.
           super__Vector_impl_data._M_finish)->_M_value + 8) = 0;
  *(undefined8 *)
   local_190.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
   _M_impl.super__Vector_impl_data._M_finish[1]._M_value = 0x3ff0000000000000;
  *(undefined8 *)
   (local_190.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
    _M_impl.super__Vector_impl_data._M_finish[1]._M_value + 8) = 0;
  *(undefined8 *)
   local_190.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
   _M_impl.super__Vector_impl_data._M_finish[2]._M_value = 0x3ff0000000000000;
  *(undefined8 *)
   (local_190.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
    _M_impl.super__Vector_impl_data._M_finish[2]._M_value + 8) = 0;
  *(undefined8 *)
   local_190.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
   _M_impl.super__Vector_impl_data._M_finish[3]._M_value = 0;
  *(undefined8 *)
   (local_190.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
    _M_impl.super__Vector_impl_data._M_finish[3]._M_value + 8) = 0;
  qclab::dense::kron<std::complex<double>>
            ((dense *)local_1e0,(SquareMatrix<std::complex<double>_> *)&local_190,&local_a0);
  qclab::dense::kron<std::complex<double>>
            ((dense *)&local_128,&local_a0,(SquareMatrix<std::complex<double>_> *)local_1e0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128._M_dataplus._M_p ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_1c8._1_7_,local_1c8[0])) {
    if (0 < (long)local_128._M_dataplus._M_p) {
      psVar13 = (size_type *)((_Alloc_hider *)(local_1c0._M_head_impl)->_M_value + 1);
      lVar8 = local_128._M_string_length + 8;
      paVar20 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x0;
      uVar30 = 0;
      do {
        lVar26 = 0;
        _Var27._M_p = local_128._M_dataplus._M_p;
        do {
          dVar2 = *(double *)(lVar8 + lVar26 + -8);
          pdVar1 = (double *)((long)psVar13 + lVar26 + -8);
          uVar31 = uVar30;
          if (((dVar2 != *pdVar1) || (NAN(dVar2) || NAN(*pdVar1))) ||
             ((*(double *)(lVar8 + lVar26) != *(double *)((long)psVar13 + lVar26) ||
              (uVar31 = 0,
              NAN(*(double *)(lVar8 + lVar26)) || NAN(*(double *)((long)psVar13 + lVar26))))))
          goto LAB_001a17ca;
          lVar26 = lVar26 + 0x10;
          _Var27._M_p = _Var27._M_p + -1;
        } while ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)_Var27._M_p !=
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)0x0);
        paVar20 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(paVar20->_M_local_buf + 1);
        psVar13 = psVar13 + (long)local_128._M_dataplus._M_p * 2;
        lVar8 = lVar8 + (long)local_128._M_dataplus._M_p * 0x10;
      } while (paVar20 !=
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_128._M_dataplus._M_p);
    }
    uVar31 = 1;
  }
  else {
    uVar31 = 0;
  }
LAB_001a17ca:
  local_1f8[0] = (allocator_type)uVar31;
  local_1f0._M_head_impl = (complex<double> *)0x0;
  if ((void *)local_128._M_string_length != (void *)0x0) {
    operator_delete__((void *)local_128._M_string_length);
  }
  local_128._M_string_length = 0;
  if (local_1d8._M_head_impl != (complex<double> *)0x0) {
    operator_delete__(local_1d8._M_head_impl);
  }
  local_1d8._M_head_impl = (complex<double> *)0x0;
  if (local_190.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
      _M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
    operator_delete__(local_190.
                      super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish);
  }
  if (local_1f8[0] == (allocator_type)0x0) {
    testing::Message::Message((Message *)local_1e0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_128,(internal *)local_1f8,
               (AssertionResult *)
               "mat3 == qclab::dense::kron( I1 , qclab::dense::kron( X.matrix() , I1 ) )","false",
               "true",_Var27._M_p);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_190,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/QGate1.cpp"
               ,0xcd,local_128._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_190,(Message *)local_1e0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_190);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_dataplus._M_p != &local_128.field_2) {
      operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
    }
    if ((long *)CONCAT71(local_1e0._1_7_,local_1e0[0]) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_1e0._1_7_,local_1e0[0]) + 8))();
    }
  }
  if (local_1f0._M_head_impl != (complex<double> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_1f0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_1f0._M_head_impl);
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c0._M_head_impl !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    operator_delete__(local_1c0._M_head_impl);
  }
  if (local_170._M_head_impl != (complex<double> *)0x0) {
    operator_delete__(local_170._M_head_impl);
  }
  operator_delete__(puVar7);
  if (local_140.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
      _M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
    operator_delete__(local_140.
                      super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish);
  }
  local_1b0._8_8_ = local_1b0._8_8_ & 0xffffffff00000000;
  local_1b0._0_8_ = &PTR_nbQubits_004e8e78;
  qclab::dense::SquareMatrix<std::complex<double>_>::SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)&local_140,&local_a0);
  pcVar10 = (char *)0x0;
  qclab::qgates::PauliX<std::complex<double>_>::apply
            ((PauliX<std::complex<double>_> *)local_1b0,Right,NoTrans,1,
             (SquareMatrix<std::complex<double>_> *)&local_140,0);
  puVar7 = (undefined8 *)operator_new__(0x40);
  *puVar7 = 0;
  puVar7[1] = 0;
  puVar7[2] = 0x3ff0000000000000;
  puVar7[3] = 0;
  puVar7[4] = 0x3ff0000000000000;
  puVar7[5] = 0;
  puVar7[6] = 0;
  puVar7[7] = 0;
  if (local_140.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
      _M_impl.super__Vector_impl_data._M_start == (pointer)0x2) {
    pcVar9 = (char *)((long)local_140.
                            super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish + 8);
    puVar12 = puVar7 + 1;
    lVar8 = 0;
    do {
      lVar26 = 0;
      do {
        dVar2 = *(double *)((long)puVar12 + lVar26 + -8);
        local_178[0] = (allocator_type)0x0;
        if (((dVar2 != *(double *)(pcVar9 + lVar26 + -8)) ||
            (NAN(dVar2) || NAN(*(double *)(pcVar9 + lVar26 + -8)))) ||
           ((*(double *)((long)puVar12 + lVar26) != *(double *)(pcVar9 + lVar26) ||
            (NAN(*(double *)((long)puVar12 + lVar26)) || NAN(*(double *)(pcVar9 + lVar26))))))
        goto LAB_001a19f3;
        lVar26 = lVar26 + 0x10;
      } while (lVar26 != 0x20);
      lVar8 = lVar8 + 1;
      pcVar9 = pcVar9 + 0x20;
      puVar12 = puVar12 + 4;
      local_178[0] = (allocator_type)0x1;
    } while (lVar8 != 2);
  }
  else {
    local_178[0] = (allocator_type)0x0;
  }
LAB_001a19f3:
  local_170._M_head_impl = (complex<double> *)0x0;
  operator_delete__(puVar7);
  if (local_178[0] == (allocator_type)0x0) {
    testing::Message::Message((Message *)local_1c8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_128,(internal *)local_178,(AssertionResult *)"mat1 == X.matrix()","false",
               "true",pcVar10);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_1f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/QGate1.cpp"
               ,0xd7,local_128._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_1f8,(Message *)local_1c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_1f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_dataplus._M_p != &local_128.field_2) {
      operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
    }
    if ((long *)CONCAT71(local_1c8._1_7_,local_1c8[0]) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_1c8._1_7_,local_1c8[0]) + 8))();
    }
  }
  if ((_Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>)
      local_170._M_head_impl != (complex<double> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_178 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_170._M_head_impl);
  }
  local_128._M_dataplus._M_p = (pointer)0x2;
  local_128._M_string_length = (size_type)operator_new__(0x40);
  *(undefined8 *)local_128._M_string_length = 0x4000000000000000;
  *(undefined8 *)(local_128._M_string_length + 8) = 0;
  *(undefined1 **)(local_128._M_string_length + 0x10) = &DAT_4014000000000000;
  *(undefined8 *)(local_128._M_string_length + 0x18) = 0;
  *(undefined1 **)(local_128._M_string_length + 0x20) = &DAT_4008000000000000;
  *(undefined8 *)(local_128._M_string_length + 0x28) = 0;
  *(undefined1 **)(local_128._M_string_length + 0x30) = &DAT_401c000000000000;
  *(undefined8 *)(local_128._M_string_length + 0x38) = 0;
  qclab::dense::SquareMatrix<std::complex<double>_>::operator=
            ((SquareMatrix<std::complex<double>_> *)&local_140,
             (SquareMatrix<std::complex<double>_> *)&local_128);
  if ((undefined8 *)local_128._M_string_length != (undefined8 *)0x0) {
    operator_delete__((void *)local_128._M_string_length);
  }
  pcVar10 = (char *)0x0;
  qclab::qgates::PauliX<std::complex<double>_>::apply
            ((PauliX<std::complex<double>_> *)local_1b0,Right,NoTrans,1,
             (SquareMatrix<std::complex<double>_> *)&local_140,0);
  puVar7 = (undefined8 *)operator_new__(0x40);
  *puVar7 = &DAT_4014000000000000;
  puVar7[1] = 0;
  puVar7[2] = 0x4000000000000000;
  puVar7[3] = 0;
  puVar7[4] = &DAT_401c000000000000;
  puVar7[5] = 0;
  puVar7[6] = &DAT_4008000000000000;
  puVar7[7] = 0;
  if (local_140.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
      _M_impl.super__Vector_impl_data._M_start == (pointer)0x2) {
    pcVar9 = (local_140.
              super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
              _M_impl.super__Vector_impl_data._M_finish)->_M_value + 8;
    puVar12 = puVar7 + 1;
    lVar8 = 0;
    do {
      lVar26 = 0;
      do {
        dVar2 = *(double *)((long)puVar12 + lVar26 + -8);
        if ((((dVar2 != *(double *)(pcVar9 + lVar26 + -8)) ||
             (NAN(dVar2) || NAN(*(double *)(pcVar9 + lVar26 + -8)))) ||
            (*(double *)((long)puVar12 + lVar26) != *(double *)(pcVar9 + lVar26))) ||
           (NAN(*(double *)((long)puVar12 + lVar26)) || NAN(*(double *)(pcVar9 + lVar26))))
        goto LAB_001a1bfb;
        lVar26 = lVar26 + 0x10;
      } while (lVar26 != 0x20);
      lVar8 = lVar8 + 1;
      pcVar9 = pcVar9 + 0x20;
      puVar12 = puVar12 + 4;
    } while (lVar8 != 2);
  }
  else {
LAB_001a1bfb:
    local_178[0] = (allocator_type)0x0;
    local_170._M_head_impl = (complex<double> *)0x0;
    testing::Message::Message((Message *)local_1c8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_128,(internal *)local_178,(AssertionResult *)"mat1 == check1","false","true",
               pcVar10);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_1f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/QGate1.cpp"
               ,0xdd,local_128._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_1f8,(Message *)local_1c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_1f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_dataplus._M_p != &local_128.field_2) {
      operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
    }
    if ((long *)CONCAT71(local_1c8._1_7_,local_1c8[0]) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_1c8._1_7_,local_1c8[0]) + 8))();
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_170._M_head_impl
        != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_178 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_170._M_head_impl);
    }
  }
  qclab::dense::SquareMatrix<std::complex<double>_>::SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)local_178,&local_90);
  _Var27._M_p = (pointer)0x0;
  qclab::qgates::PauliX<std::complex<double>_>::apply
            ((PauliX<std::complex<double>_> *)local_1b0,Right,NoTrans,2,
             (SquareMatrix<std::complex<double>_> *)local_178,0);
  local_1f8 = (undefined1  [8])0x2;
  local_1f0._M_head_impl = (complex<double> *)operator_new__(0x40);
  *(undefined8 *)(local_1f0._M_head_impl)->_M_value = 0;
  *(undefined8 *)((long)(local_1f0._M_head_impl)->_M_value + 8) = 0;
  *(undefined8 *)local_1f0._M_head_impl[1]._M_value = 0x3ff0000000000000;
  *(undefined8 *)(local_1f0._M_head_impl[1]._M_value + 8) = 0;
  *(undefined8 *)local_1f0._M_head_impl[2]._M_value = 0x3ff0000000000000;
  *(undefined8 *)(local_1f0._M_head_impl[2]._M_value + 8) = 0;
  *(undefined8 *)local_1f0._M_head_impl[3]._M_value = 0;
  *(undefined8 *)(local_1f0._M_head_impl[3]._M_value + 8) = 0;
  qclab::dense::kron<std::complex<double>>
            ((dense *)&local_128,(SquareMatrix<std::complex<double>_> *)local_1f8,&local_a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128._M_dataplus._M_p ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_178._1_7_,local_178[0])) {
    if (0 < (long)local_128._M_dataplus._M_p) {
      psVar13 = (size_type *)((long)local_170._M_head_impl + 8);
      puVar12 = (undefined8 *)(local_128._M_string_length + 8);
      paVar20 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x0;
      vVar29 = (vector<std::complex<double>,std::allocator<std::complex<double>>>)0x0;
      do {
        lVar8 = 0;
        _Var27._M_p = local_128._M_dataplus._M_p;
        do {
          dVar2 = *(double *)((long)puVar12 + lVar8 + -8);
          pdVar1 = (double *)((long)psVar13 + lVar8 + -8);
          local_1c8[0] = vVar29;
          if (((dVar2 != *pdVar1) || (NAN(dVar2) || NAN(*pdVar1))) ||
             ((*(double *)((long)puVar12 + lVar8) != *(double *)((long)psVar13 + lVar8) ||
              (local_1c8[0] = (vector<std::complex<double>,std::allocator<std::complex<double>>>)0x0
              , NAN(*(double *)((long)puVar12 + lVar8)) || NAN(*(double *)((long)psVar13 + lVar8))))
             )) goto LAB_001a1dcd;
          lVar8 = lVar8 + 0x10;
          _Var27._M_p = _Var27._M_p + -1;
        } while ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)_Var27._M_p !=
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)0x0);
        paVar20 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(paVar20->_M_local_buf + 1);
        psVar13 = psVar13 + (long)local_128._M_dataplus._M_p * 2;
        puVar12 = puVar12 + (long)local_128._M_dataplus._M_p * 2;
      } while (paVar20 !=
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_128._M_dataplus._M_p);
    }
    local_1c8[0] = (vector<std::complex<double>,std::allocator<std::complex<double>>>)0x1;
  }
  else {
    local_1c8[0] = (vector<std::complex<double>,std::allocator<std::complex<double>>>)0x0;
  }
LAB_001a1dcd:
  local_1c0._M_head_impl = (complex<double> *)0x0;
  if ((undefined8 *)local_128._M_string_length != (undefined8 *)0x0) {
    operator_delete__((void *)local_128._M_string_length);
  }
  local_128._M_string_length = 0;
  if (local_1f0._M_head_impl != (complex<double> *)0x0) {
    operator_delete__(local_1f0._M_head_impl);
  }
  if (local_1c8[0] == (vector<std::complex<double>,std::allocator<std::complex<double>>>)0x0) {
    testing::Message::Message((Message *)local_1f8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_128,(internal *)local_1c8,
               (AssertionResult *)"mat2 == qclab::dense::kron( X.matrix() , I1 )","false","true",
               _Var27._M_p);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_1e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/QGate1.cpp"
               ,0xe2,local_128._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_1e0,(Message *)local_1f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_1e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_dataplus._M_p != &local_128.field_2) {
      operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
    }
    if (local_1f8 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_1f8 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c0._M_head_impl !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_1c0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_1c0._M_head_impl);
  }
  local_1b0._8_4_ = 1;
  qclab::dense::SquareMatrix<std::complex<double>_>::operator=
            ((SquareMatrix<std::complex<double>_> *)local_178,&local_90);
  _Var27._M_p = (pointer)0x0;
  qclab::qgates::PauliX<std::complex<double>_>::apply
            ((PauliX<std::complex<double>_> *)local_1b0,Right,NoTrans,2,
             (SquareMatrix<std::complex<double>_> *)local_178,0);
  local_1f8 = (undefined1  [8])0x2;
  local_1f0._M_head_impl = (complex<double> *)operator_new__(0x40);
  *(undefined8 *)(local_1f0._M_head_impl)->_M_value = 0;
  *(undefined8 *)((long)(local_1f0._M_head_impl)->_M_value + 8) = 0;
  *(undefined8 *)local_1f0._M_head_impl[1]._M_value = 0x3ff0000000000000;
  *(undefined8 *)(local_1f0._M_head_impl[1]._M_value + 8) = 0;
  *(undefined8 *)local_1f0._M_head_impl[2]._M_value = 0x3ff0000000000000;
  *(undefined8 *)(local_1f0._M_head_impl[2]._M_value + 8) = 0;
  *(undefined8 *)local_1f0._M_head_impl[3]._M_value = 0;
  *(undefined8 *)(local_1f0._M_head_impl[3]._M_value + 8) = 0;
  qclab::dense::kron<std::complex<double>>
            ((dense *)&local_128,&local_a0,(SquareMatrix<std::complex<double>_> *)local_1f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128._M_dataplus._M_p ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_178._1_7_,local_178[0])) {
    if (0 < (long)local_128._M_dataplus._M_p) {
      psVar13 = (size_type *)((_Alloc_hider *)(local_170._M_head_impl)->_M_value + 1);
      lVar8 = local_128._M_string_length + 8;
      paVar20 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x0;
      vVar29 = (vector<std::complex<double>,std::allocator<std::complex<double>>>)0x0;
      do {
        lVar26 = 0;
        _Var27._M_p = local_128._M_dataplus._M_p;
        do {
          dVar2 = *(double *)(lVar8 + lVar26 + -8);
          pdVar1 = (double *)((long)psVar13 + lVar26 + -8);
          local_1c8[0] = vVar29;
          if (((dVar2 != *pdVar1) || (NAN(dVar2) || NAN(*pdVar1))) ||
             ((*(double *)(lVar8 + lVar26) != *(double *)((long)psVar13 + lVar26) ||
              (local_1c8[0] = (vector<std::complex<double>,std::allocator<std::complex<double>>>)0x0
              , NAN(*(double *)(lVar8 + lVar26)) || NAN(*(double *)((long)psVar13 + lVar26))))))
          goto LAB_001a1fd9;
          lVar26 = lVar26 + 0x10;
          _Var27._M_p = _Var27._M_p + -1;
        } while ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)_Var27._M_p !=
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)0x0);
        paVar20 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(paVar20->_M_local_buf + 1);
        psVar13 = psVar13 + (long)local_128._M_dataplus._M_p * 2;
        lVar8 = lVar8 + (long)local_128._M_dataplus._M_p * 0x10;
      } while (paVar20 !=
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_128._M_dataplus._M_p);
    }
    local_1c8[0] = (vector<std::complex<double>,std::allocator<std::complex<double>>>)0x1;
  }
  else {
    local_1c8[0] = (vector<std::complex<double>,std::allocator<std::complex<double>>>)0x0;
  }
LAB_001a1fd9:
  local_1c0._M_head_impl = (complex<double> *)0x0;
  if ((void *)local_128._M_string_length != (void *)0x0) {
    operator_delete__((void *)local_128._M_string_length);
  }
  local_128._M_string_length = 0;
  if (local_1f0._M_head_impl != (complex<double> *)0x0) {
    operator_delete__(local_1f0._M_head_impl);
  }
  if (local_1c8[0] == (vector<std::complex<double>,std::allocator<std::complex<double>>>)0x0) {
    testing::Message::Message((Message *)local_1f8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_128,(internal *)local_1c8,
               (AssertionResult *)"mat2 == qclab::dense::kron( I1 , X.matrix() )","false","true",
               _Var27._M_p);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_1e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/QGate1.cpp"
               ,0xe7,local_128._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_1e0,(Message *)local_1f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_1e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_dataplus._M_p != &local_128.field_2) {
      operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
    }
    if (local_1f8 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_1f8 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c0._M_head_impl !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_1c0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_1c0._M_head_impl);
  }
  qclab::dense::SquareMatrix<std::complex<double>_>::SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)local_1c8,&local_68);
  _Var27._M_p = (pointer)0x0;
  qclab::qgates::PauliX<std::complex<double>_>::apply
            ((PauliX<std::complex<double>_> *)local_1b0,Right,NoTrans,3,
             (SquareMatrix<std::complex<double>_> *)local_1c8,0);
  local_190.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x2;
  local_190.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)operator_new__(0x40);
  *(undefined8 *)
   (local_190.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
    _M_impl.super__Vector_impl_data._M_finish)->_M_value = 0;
  *(undefined8 *)
   ((long)(local_190.
           super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl.
           super__Vector_impl_data._M_finish)->_M_value + 8) = 0;
  *(undefined8 *)
   local_190.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
   _M_impl.super__Vector_impl_data._M_finish[1]._M_value = 0x3ff0000000000000;
  *(undefined8 *)
   (local_190.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
    _M_impl.super__Vector_impl_data._M_finish[1]._M_value + 8) = 0;
  *(undefined8 *)
   local_190.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
   _M_impl.super__Vector_impl_data._M_finish[2]._M_value = 0x3ff0000000000000;
  *(undefined8 *)
   (local_190.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
    _M_impl.super__Vector_impl_data._M_finish[2]._M_value + 8) = 0;
  *(undefined8 *)
   local_190.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
   _M_impl.super__Vector_impl_data._M_finish[3]._M_value = 0;
  *(undefined8 *)
   (local_190.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
    _M_impl.super__Vector_impl_data._M_finish[3]._M_value + 8) = 0;
  qclab::dense::kron<std::complex<double>>
            ((dense *)local_1e0,(SquareMatrix<std::complex<double>_> *)&local_190,&local_a0);
  qclab::dense::kron<std::complex<double>>
            ((dense *)&local_128,&local_a0,(SquareMatrix<std::complex<double>_> *)local_1e0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128._M_dataplus._M_p ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_1c8._1_7_,local_1c8[0])) {
    if (0 < (long)local_128._M_dataplus._M_p) {
      psVar13 = (size_type *)((_Alloc_hider *)(local_1c0._M_head_impl)->_M_value + 1);
      lVar8 = local_128._M_string_length + 8;
      paVar20 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x0;
      uVar30 = 0;
      do {
        lVar26 = 0;
        _Var27._M_p = local_128._M_dataplus._M_p;
        do {
          dVar2 = *(double *)(lVar8 + lVar26 + -8);
          pdVar1 = (double *)((long)psVar13 + lVar26 + -8);
          uVar31 = uVar30;
          if ((((dVar2 != *pdVar1) || (NAN(dVar2) || NAN(*pdVar1))) ||
              (*(double *)(lVar8 + lVar26) != *(double *)((long)psVar13 + lVar26))) ||
             (uVar31 = 0,
             NAN(*(double *)(lVar8 + lVar26)) || NAN(*(double *)((long)psVar13 + lVar26))))
          goto LAB_001a21eb;
          lVar26 = lVar26 + 0x10;
          _Var27._M_p = _Var27._M_p + -1;
        } while ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)_Var27._M_p !=
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)0x0);
        paVar20 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(paVar20->_M_local_buf + 1);
        psVar13 = psVar13 + (long)local_128._M_dataplus._M_p * 2;
        lVar8 = lVar8 + (long)local_128._M_dataplus._M_p * 0x10;
      } while (paVar20 !=
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_128._M_dataplus._M_p);
    }
    uVar31 = 1;
  }
  else {
    uVar31 = 0;
  }
LAB_001a21eb:
  local_1f8[0] = (allocator_type)uVar31;
  local_1f0._M_head_impl = (complex<double> *)0x0;
  if ((void *)local_128._M_string_length != (void *)0x0) {
    operator_delete__((void *)local_128._M_string_length);
  }
  local_128._M_string_length = 0;
  if (local_1d8._M_head_impl != (complex<double> *)0x0) {
    operator_delete__(local_1d8._M_head_impl);
  }
  local_1d8._M_head_impl = (complex<double> *)0x0;
  if (local_190.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
      _M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
    operator_delete__(local_190.
                      super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish);
  }
  if (local_1f8[0] == (allocator_type)0x0) {
    testing::Message::Message((Message *)local_1e0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_128,(internal *)local_1f8,
               (AssertionResult *)
               "mat3 == qclab::dense::kron( I1 , qclab::dense::kron( X.matrix() , I1 ) )","false",
               "true",_Var27._M_p);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_190,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/QGate1.cpp"
               ,0xed,local_128._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_190,(Message *)local_1e0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_190);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_dataplus._M_p != &local_128.field_2) {
      operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
    }
    if ((long *)CONCAT71(local_1e0._1_7_,local_1e0[0]) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_1e0._1_7_,local_1e0[0]) + 8))();
    }
  }
  if (local_1f0._M_head_impl != (complex<double> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_1f0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_1f0._M_head_impl);
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c0._M_head_impl !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    operator_delete__(local_1c0._M_head_impl);
  }
  if (local_170._M_head_impl != (complex<double> *)0x0) {
    operator_delete__(local_170._M_head_impl);
  }
  operator_delete__(puVar7);
  if (local_140.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
      _M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
    operator_delete__(local_140.
                      super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish);
  }
  local_128._M_string_length = local_128._M_string_length & 0xffffff0000000000;
  local_128.field_2._M_allocated_capacity = 0;
  local_128.field_2._8_8_ = 0x3ff0000000000000;
  local_128._M_dataplus._M_p = (pointer)&PTR_nbQubits_004ea318;
  local_1b0._0_8_ = (pointer)0x2;
  local_1b0._8_8_ = operator_new__(0x40);
  *(undefined8 *)((pointer)local_1b0._8_8_)->_M_value = 0;
  *(undefined8 *)((long)((pointer)local_1b0._8_8_)->_M_value + 8) = 0;
  *(undefined8 *)((pointer)(local_1b0._8_8_ + 0x10))->_M_value = 0x3ff0000000000000;
  *(undefined8 *)(((pointer)(local_1b0._8_8_ + 0x10))->_M_value + 8) = 0;
  *(undefined1 **)((pointer)(local_1b0._8_8_ + 0x20))->_M_value = &DAT_bff0000000000000;
  *(undefined8 *)(((pointer)(local_1b0._8_8_ + 0x20))->_M_value + 8) = 0;
  *(undefined8 *)((pointer)(local_1b0._8_8_ + 0x30))->_M_value = 0;
  *(undefined8 *)(((pointer)(local_1b0._8_8_ + 0x30))->_M_value + 8) = 0;
  qclab::dense::trans<qclab::dense::SquareMatrix<std::complex<double>>>
            ((dense *)&local_140,(SquareMatrix<std::complex<double>_> *)local_1b0);
  if ((pointer)local_1b0._8_8_ != (pointer)0x0) {
    operator_delete__((void *)local_1b0._8_8_);
  }
  qclab::dense::SquareMatrix<std::complex<double>_>::SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)local_178,&local_a0);
  pcVar28 = (pointer)0x0;
  qclab::qgates::RotationY<std::complex<double>_>::apply
            ((RotationY<std::complex<double>_> *)&local_128,Left,Trans,1,
             (SquareMatrix<std::complex<double>_> *)local_178,0);
  if (local_140.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
      _M_impl.super__Vector_impl_data._M_start == (pointer)CONCAT71(local_178._1_7_,local_178[0])) {
    if (0 < (long)local_140.
                  super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
                  _M_impl.super__Vector_impl_data._M_start) {
      psVar13 = (size_type *)((long)local_170._M_head_impl + 8);
      pcVar10 = (char *)((long)local_140.
                               super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish + 8);
      pcVar21 = (pointer)0x0;
      do {
        lVar8 = 0;
        pcVar28 = local_140.
                  super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        do {
          pdVar1 = (double *)((long)psVar13 + lVar8 + -8);
          if (((*(double *)(pcVar10 + lVar8 + -8) != *pdVar1) ||
              (NAN(*(double *)(pcVar10 + lVar8 + -8)) || NAN(*pdVar1))) ||
             ((*(double *)(pcVar10 + lVar8) != *(double *)((long)psVar13 + lVar8) ||
              (NAN(*(double *)(pcVar10 + lVar8)) || NAN(*(double *)((long)psVar13 + lVar8))))))
          goto LAB_001a2487;
          lVar8 = lVar8 + 0x10;
          pcVar28 = (pointer)(pcVar28[-1]._M_value + 0xf);
        } while (pcVar28 != (pointer)0x0);
        pcVar21 = (pointer)(pcVar21->_M_value + 1);
        psVar13 = psVar13 + (long)local_140.
                                  super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start * 2;
        pcVar10 = pcVar10 + (long)local_140.
                                  super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start * 0x10;
      } while (pcVar21 !=
               local_140.
               super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
               _M_impl.super__Vector_impl_data._M_start);
    }
  }
  else {
LAB_001a2487:
    local_1c8[0] = (vector<std::complex<double>,std::allocator<std::complex<double>>>)0x0;
    local_1c0._M_head_impl = (complex<double> *)0x0;
    testing::Message::Message((Message *)local_1f8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_1b0,(internal *)local_1c8,(AssertionResult *)"mat1 == Ytrans","false"
               ,"true",(char *)pcVar28);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_1e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/QGate1.cpp"
               ,0xf8,(char *)local_1b0._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_1e0,(Message *)local_1f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_1e0);
    if ((pointer)local_1b0._0_8_ != (pointer)(local_1b0 + 0x10)) {
      operator_delete((void *)local_1b0._0_8_,CONCAT44(local_1b0._20_4_,local_1b0._16_4_) + 1);
    }
    if (local_1f8 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_1f8 + 8))();
    }
    if (local_1c0._M_head_impl != (complex<double> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_1c0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_1c0._M_head_impl);
    }
  }
  local_1b0._0_8_ = (AssertHelperData *)0x2;
  local_1b0._8_8_ = operator_new__(0x40);
  *(undefined8 *)((pointer)local_1b0._8_8_)->_M_value = 0x4000000000000000;
  *(undefined8 *)((long)((pointer)local_1b0._8_8_)->_M_value + 8) = 0;
  *(undefined1 **)((pointer)(local_1b0._8_8_ + 0x10))->_M_value = &DAT_4014000000000000;
  *(undefined8 *)(((pointer)(local_1b0._8_8_ + 0x10))->_M_value + 8) = 0;
  *(undefined1 **)((pointer)(local_1b0._8_8_ + 0x20))->_M_value = &DAT_4008000000000000;
  *(undefined8 *)(((pointer)(local_1b0._8_8_ + 0x20))->_M_value + 8) = 0;
  *(undefined1 **)((pointer)(local_1b0._8_8_ + 0x30))->_M_value = &DAT_401c000000000000;
  *(undefined8 *)(((pointer)(local_1b0._8_8_ + 0x30))->_M_value + 8) = 0;
  qclab::dense::SquareMatrix<std::complex<double>_>::operator=
            ((SquareMatrix<std::complex<double>_> *)local_178,
             (SquareMatrix<std::complex<double>_> *)local_1b0);
  if ((pointer)local_1b0._8_8_ != (pointer)0x0) {
    operator_delete__((void *)local_1b0._8_8_);
  }
  pcVar10 = (char *)0x0;
  qclab::qgates::RotationY<std::complex<double>_>::apply
            ((RotationY<std::complex<double>_> *)&local_128,Left,Trans,1,
             (SquareMatrix<std::complex<double>_> *)local_178,0);
  puVar7 = (undefined8 *)operator_new__(0x40);
  *puVar7 = 0xc008000000000000;
  puVar7[1] = 0;
  puVar7[2] = 0xc01c000000000000;
  puVar7[3] = 0;
  puVar7[4] = 0x4000000000000000;
  puVar7[5] = 0;
  puVar7[6] = &DAT_4014000000000000;
  puVar7[7] = 0;
  if (CONCAT71(local_178._1_7_,local_178[0]) == 2) {
    psVar13 = (size_type *)((long)local_170._M_head_impl + 8);
    puVar12 = puVar7 + 1;
    lVar8 = 0;
    do {
      lVar26 = 0;
      do {
        dVar2 = *(double *)((long)puVar12 + lVar26 + -8);
        pdVar1 = (double *)((long)psVar13 + lVar26 + -8);
        if (((dVar2 != *pdVar1) || (NAN(dVar2) || NAN(*pdVar1))) ||
           ((*(double *)((long)puVar12 + lVar26) != *(double *)((long)psVar13 + lVar26) ||
            (NAN(*(double *)((long)puVar12 + lVar26)) || NAN(*(double *)((long)psVar13 + lVar26)))))
           ) goto LAB_001a2663;
        lVar26 = lVar26 + 0x10;
      } while (lVar26 != 0x20);
      lVar8 = lVar8 + 1;
      psVar13 = psVar13 + 4;
      puVar12 = puVar12 + 4;
    } while (lVar8 != 2);
  }
  else {
LAB_001a2663:
    local_1c8[0] = (vector<std::complex<double>,std::allocator<std::complex<double>>>)0x0;
    local_1c0._M_head_impl = (complex<double> *)0x0;
    testing::Message::Message((Message *)local_1f8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_1b0,(internal *)local_1c8,(AssertionResult *)"mat1 == check1","false"
               ,"true",pcVar10);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_1e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/QGate1.cpp"
               ,0xfe,(char *)local_1b0._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_1e0,(Message *)local_1f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_1e0);
    if ((AssertHelperData *)local_1b0._0_8_ != (AssertHelperData *)(local_1b0 + 0x10)) {
      operator_delete((void *)local_1b0._0_8_,CONCAT44(local_1b0._20_4_,local_1b0._16_4_) + 1);
    }
    if (local_1f8 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_1f8 + 8))();
    }
    if (local_1c0._M_head_impl != (complex<double> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_1c0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_1c0._M_head_impl);
    }
  }
  qclab::dense::SquareMatrix<std::complex<double>_>::SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)local_1c8,&local_90);
  pcVar10 = (char *)0x0;
  qclab::qgates::RotationY<std::complex<double>_>::apply
            ((RotationY<std::complex<double>_> *)&local_128,Left,Trans,2,
             (SquareMatrix<std::complex<double>_> *)local_1c8,0);
  qclab::dense::kron<std::complex<double>>
            ((dense *)local_1b0,(SquareMatrix<std::complex<double>_> *)&local_140,&local_a0);
  if ((AssertHelperData *)local_1b0._0_8_ ==
      (AssertHelperData *)CONCAT71(local_1c8._1_7_,local_1c8[0])) {
    if (0 < (long)local_1b0._0_8_) {
      psVar13 = (size_type *)((long)local_1c0._M_head_impl + 8);
      puVar11 = (undefined *)(local_1b0._8_8_ + 8);
      pAVar22 = (AssertHelperData *)0x0;
      aVar24 = (allocator_type)0x0;
      do {
        pcVar10 = (char *)0x0;
        pAVar23 = (AssertHelperData *)local_1b0._0_8_;
        do {
          aVar25 = (allocator_type)0x0;
          if ((((*(double *)(pcVar10 + (long)(puVar11 + -8)) !=
                 *(double *)
                  (pcVar10 +
                  (long)&((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (psVar13 + -1))->_M_dataplus)) ||
               (aVar25 = aVar24,
               NAN(*(double *)(pcVar10 + (long)(puVar11 + -8))) ||
               NAN(*(double *)
                    (pcVar10 +
                    (long)&((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (psVar13 + -1))->_M_dataplus)))) ||
              (*(double *)(pcVar10 + (long)puVar11) != *(double *)((long)psVar13 + (long)pcVar10)))
             || (NAN(*(double *)(pcVar10 + (long)puVar11)) ||
                 NAN(*(double *)((long)psVar13 + (long)pcVar10)))) goto LAB_001a27d9;
          pcVar10 = pcVar10 + 0x10;
          pAVar23 = (AssertHelperData *)((long)&pAVar23[-1].message.field_2 + 0xf);
        } while (pAVar23 != (AssertHelperData *)0x0);
        pAVar22 = (AssertHelperData *)((long)&pAVar22->type + 1);
        psVar13 = psVar13 + local_1b0._0_8_ * 2;
        puVar11 = puVar11 + local_1b0._0_8_ * 0x10;
      } while (pAVar22 != (AssertHelperData *)local_1b0._0_8_);
    }
    aVar25 = (allocator_type)0x1;
  }
  else {
    aVar25 = (allocator_type)0x0;
  }
LAB_001a27d9:
  local_1f8[0] = aVar25;
  local_1f0._M_head_impl = (complex<double> *)0x0;
  if ((_Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>)
      local_1b0._8_8_ != (complex<double> *)0x0) {
    operator_delete__((void *)local_1b0._8_8_);
    aVar25 = local_1f8[0];
  }
  if (((byte)aVar25 & 1) == 0) {
    testing::Message::Message((Message *)local_1e0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_1b0,(internal *)local_1f8,
               (AssertionResult *)"mat2 == qclab::dense::kron( Ytrans , I1 )","false","true",pcVar10
              );
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_190,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/QGate1.cpp"
               ,0x103,(char *)local_1b0._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_190,(Message *)local_1e0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_190);
    if ((AssertHelperData *)local_1b0._0_8_ != (AssertHelperData *)(local_1b0 + 0x10)) {
      operator_delete((void *)local_1b0._0_8_,CONCAT44(local_1b0._20_4_,local_1b0._16_4_) + 1);
    }
    if ((long *)CONCAT71(local_1e0._1_7_,local_1e0[0]) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_1e0._1_7_,local_1e0[0]) + 8))();
    }
  }
  if ((_Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>)
      local_1f0._M_head_impl != (complex<double> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_1f0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_1f0._M_head_impl);
  }
  local_128._M_string_length = CONCAT44(local_128._M_string_length._4_4_,1);
  qclab::dense::SquareMatrix<std::complex<double>_>::operator=
            ((SquareMatrix<std::complex<double>_> *)local_1c8,&local_90);
  pcVar10 = (char *)0x0;
  qclab::qgates::RotationY<std::complex<double>_>::apply
            ((RotationY<std::complex<double>_> *)&local_128,Left,Trans,2,
             (SquareMatrix<std::complex<double>_> *)local_1c8,0);
  qclab::dense::kron<std::complex<double>>
            ((dense *)local_1b0,&local_a0,(SquareMatrix<std::complex<double>_> *)&local_140);
  if ((AssertHelperData *)local_1b0._0_8_ ==
      (AssertHelperData *)CONCAT71(local_1c8._1_7_,local_1c8[0])) {
    if (0 < (long)local_1b0._0_8_) {
      psVar13 = (size_type *)((_Alloc_hider *)(local_1c0._M_head_impl)->_M_value + 1);
      puVar11 = (undefined *)(local_1b0._8_8_ + 8);
      pAVar22 = (AssertHelperData *)0x0;
      aVar24 = (allocator_type)0x0;
      do {
        pcVar10 = (char *)0x0;
        pAVar23 = (AssertHelperData *)local_1b0._0_8_;
        do {
          aVar25 = (allocator_type)0x0;
          if (((*(double *)(pcVar10 + (long)(puVar11 + -8)) !=
                *(double *)
                 (pcVar10 +
                 (long)&((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        (psVar13 + -1))->_M_dataplus)) ||
              (aVar25 = aVar24,
              NAN(*(double *)(pcVar10 + (long)(puVar11 + -8))) ||
              NAN(*(double *)
                   (pcVar10 +
                   (long)&((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          (psVar13 + -1))->_M_dataplus)))) ||
             ((*(double *)(pcVar10 + (long)puVar11) != *(double *)((long)psVar13 + (long)pcVar10) ||
              (NAN(*(double *)(pcVar10 + (long)puVar11)) ||
               NAN(*(double *)((long)psVar13 + (long)pcVar10)))))) goto LAB_001a297b;
          pcVar10 = pcVar10 + 0x10;
          pAVar23 = (AssertHelperData *)((long)&pAVar23[-1].message.field_2 + 0xf);
        } while (pAVar23 != (AssertHelperData *)0x0);
        pAVar22 = (AssertHelperData *)((long)&pAVar22->type + 1);
        psVar13 = psVar13 + local_1b0._0_8_ * 2;
        puVar11 = puVar11 + local_1b0._0_8_ * 0x10;
      } while (pAVar22 != (AssertHelperData *)local_1b0._0_8_);
    }
    aVar25 = (allocator_type)0x1;
  }
  else {
    aVar25 = (allocator_type)0x0;
  }
LAB_001a297b:
  local_1f8[0] = aVar25;
  local_1f0._M_head_impl = (complex<double> *)0x0;
  if ((_Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>)
      local_1b0._8_8_ != (complex<double> *)0x0) {
    operator_delete__((void *)local_1b0._8_8_);
    aVar25 = local_1f8[0];
  }
  if (((byte)aVar25 & 1) == 0) {
    testing::Message::Message((Message *)local_1e0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_1b0,(internal *)local_1f8,
               (AssertionResult *)"mat2 == qclab::dense::kron( I1 , Ytrans )","false","true",pcVar10
              );
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_190,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/QGate1.cpp"
               ,0x108,(char *)local_1b0._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_190,(Message *)local_1e0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_190);
    if ((AssertHelperData *)local_1b0._0_8_ != (AssertHelperData *)(local_1b0 + 0x10)) {
      operator_delete((void *)local_1b0._0_8_,CONCAT44(local_1b0._20_4_,local_1b0._16_4_) + 1);
    }
    if ((long *)CONCAT71(local_1e0._1_7_,local_1e0[0]) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_1e0._1_7_,local_1e0[0]) + 8))();
    }
  }
  if ((_Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>)
      local_1f0._M_head_impl != (complex<double> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_1f0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_1f0._M_head_impl);
  }
  qclab::dense::SquareMatrix<std::complex<double>_>::SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)local_1f8,&local_68);
  pAVar22 = (AssertHelperData *)0x0;
  qclab::qgates::RotationY<std::complex<double>_>::apply
            ((RotationY<std::complex<double>_> *)&local_128,Left,Trans,3,
             (SquareMatrix<std::complex<double>_> *)local_1f8,0);
  qclab::dense::kron<std::complex<double>>
            ((dense *)&local_190,(SquareMatrix<std::complex<double>_> *)&local_140,&local_a0);
  qclab::dense::kron<std::complex<double>>
            ((dense *)local_1b0,&local_a0,(SquareMatrix<std::complex<double>_> *)&local_190);
  if ((undefined1  [8])local_1b0._0_8_ == local_1f8) {
    if (0 < (long)local_1b0._0_8_) {
      psVar13 = (size_type *)((long)local_1f0._M_head_impl + 8);
      lVar8 = (long)(void *)local_1b0._8_8_ + 8;
      pAVar23 = (AssertHelperData *)0x0;
      vVar29 = (vector<std::complex<double>,std::allocator<std::complex<double>>>)0x0;
      do {
        lVar26 = 0;
        pAVar22 = (AssertHelperData *)local_1b0._0_8_;
        do {
          dVar2 = *(double *)(lVar8 + lVar26 + -8);
          pdVar1 = (double *)((long)psVar13 + lVar26 + -8);
          local_1e0[0] = vVar29;
          if (((dVar2 != *pdVar1) || (NAN(dVar2) || NAN(*pdVar1))) ||
             ((*(double *)(lVar8 + lVar26) != *(double *)((long)psVar13 + lVar26) ||
              (local_1e0[0] = (vector<std::complex<double>,std::allocator<std::complex<double>>>)0x0
              , NAN(*(double *)(lVar8 + lVar26)) || NAN(*(double *)((long)psVar13 + lVar26))))))
          goto LAB_001a2b24;
          lVar26 = lVar26 + 0x10;
          pAVar22 = (AssertHelperData *)((long)&pAVar22[-1].message.field_2 + 0xf);
        } while (pAVar22 != (AssertHelperData *)0x0);
        pAVar23 = (AssertHelperData *)((long)&pAVar23->type + 1);
        psVar13 = psVar13 + local_1b0._0_8_ * 2;
        lVar8 = lVar8 + local_1b0._0_8_ * 0x10;
      } while (pAVar23 != (AssertHelperData *)local_1b0._0_8_);
    }
    local_1e0[0] = (vector<std::complex<double>,std::allocator<std::complex<double>>>)0x1;
  }
  else {
    local_1e0[0] = (vector<std::complex<double>,std::allocator<std::complex<double>>>)0x0;
  }
LAB_001a2b24:
  local_1d8._M_head_impl = (complex<double> *)0x0;
  if ((pointer)local_1b0._8_8_ != (pointer)0x0) {
    operator_delete__((void *)local_1b0._8_8_);
  }
  local_1b0._8_8_ =
       (_Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>)0x0;
  if (local_190.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
      _M_impl.super__Vector_impl_data._M_finish != (complex<double> *)0x0) {
    operator_delete__(local_190.
                      super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish);
  }
  if (local_1e0[0] == (vector<std::complex<double>,std::allocator<std::complex<double>>>)0x0) {
    testing::Message::Message((Message *)&local_190);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_1b0,(internal *)local_1e0,
               (AssertionResult *)
               "mat3 == qclab::dense::kron( I1 , qclab::dense::kron( Ytrans , I1 ) )","false","true"
               ,(char *)pAVar22);
    testing::internal::AssertHelper::AssertHelper
              (&local_160,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/QGate1.cpp"
               ,0x10e,(char *)local_1b0._0_8_);
    testing::internal::AssertHelper::operator=(&local_160,(Message *)&local_190);
    testing::internal::AssertHelper::~AssertHelper(&local_160);
    if ((AssertHelperData *)local_1b0._0_8_ != (AssertHelperData *)(local_1b0 + 0x10)) {
      operator_delete((void *)local_1b0._0_8_,CONCAT44(local_1b0._20_4_,local_1b0._16_4_) + 1);
    }
    if (local_190.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      (**(code **)(*(long *)(local_190.
                             super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->_M_value + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d8._M_head_impl !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_1d8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_1d8._M_head_impl);
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1f0._M_head_impl !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    operator_delete__(local_1f0._M_head_impl);
  }
  if (local_1c0._M_head_impl != (complex<double> *)0x0) {
    operator_delete__(local_1c0._M_head_impl);
  }
  operator_delete__(puVar7);
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_170._M_head_impl !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    operator_delete__(local_170._M_head_impl);
  }
  if (local_140.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
      _M_impl.super__Vector_impl_data._M_finish != (complex<double> *)0x0) {
    operator_delete__(local_140.
                      super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish);
  }
  local_128._M_string_length = local_128._M_string_length & 0xffffff0000000000;
  local_128.field_2._M_allocated_capacity = 0;
  local_128.field_2._8_8_ = 0x3ff0000000000000;
  local_128._M_dataplus._M_p = (pointer)&PTR_nbQubits_004ea318;
  local_1b0._0_8_ = (pointer)0x2;
  local_1b0._8_8_ = operator_new__(0x40);
  *(undefined8 *)((pointer)local_1b0._8_8_)->_M_value = 0;
  *(undefined8 *)((long)((pointer)local_1b0._8_8_)->_M_value + 8) = 0;
  *(undefined8 *)((pointer)(local_1b0._8_8_ + 0x10))->_M_value = 0x3ff0000000000000;
  *(undefined8 *)(((pointer)(local_1b0._8_8_ + 0x10))->_M_value + 8) = 0;
  *(undefined1 **)((pointer)(local_1b0._8_8_ + 0x20))->_M_value = &DAT_bff0000000000000;
  *(undefined8 *)(((pointer)(local_1b0._8_8_ + 0x20))->_M_value + 8) = 0;
  *(undefined8 *)((pointer)(local_1b0._8_8_ + 0x30))->_M_value = 0;
  *(undefined8 *)(((pointer)(local_1b0._8_8_ + 0x30))->_M_value + 8) = 0;
  qclab::dense::trans<qclab::dense::SquareMatrix<std::complex<double>>>
            ((dense *)&local_140,(SquareMatrix<std::complex<double>_> *)local_1b0);
  if ((pointer)local_1b0._8_8_ != (pointer)0x0) {
    operator_delete__((void *)local_1b0._8_8_);
  }
  qclab::dense::SquareMatrix<std::complex<double>_>::SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)local_178,&local_a0);
  pcVar28 = (pointer)0x0;
  qclab::qgates::RotationY<std::complex<double>_>::apply
            ((RotationY<std::complex<double>_> *)&local_128,Right,Trans,1,
             (SquareMatrix<std::complex<double>_> *)local_178,0);
  if (local_140.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
      _M_impl.super__Vector_impl_data._M_start == (pointer)CONCAT71(local_178._1_7_,local_178[0])) {
    if (0 < (long)local_140.
                  super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
                  _M_impl.super__Vector_impl_data._M_start) {
      psVar13 = (size_type *)((long)local_170._M_head_impl + 8);
      pcVar10 = (char *)((long)local_140.
                               super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish + 8);
      pcVar21 = (pointer)0x0;
      do {
        lVar8 = 0;
        pcVar28 = local_140.
                  super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        do {
          pdVar1 = (double *)((long)psVar13 + lVar8 + -8);
          if ((((*(double *)(pcVar10 + lVar8 + -8) != *pdVar1) ||
               (NAN(*(double *)(pcVar10 + lVar8 + -8)) || NAN(*pdVar1))) ||
              (*(double *)(pcVar10 + lVar8) != *(double *)((long)psVar13 + lVar8))) ||
             (NAN(*(double *)(pcVar10 + lVar8)) || NAN(*(double *)((long)psVar13 + lVar8))))
          goto LAB_001a2da7;
          lVar8 = lVar8 + 0x10;
          pcVar28 = (pointer)(pcVar28[-1]._M_value + 0xf);
        } while (pcVar28 != (pointer)0x0);
        pcVar21 = (pointer)(pcVar21->_M_value + 1);
        psVar13 = psVar13 + (long)local_140.
                                  super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start * 2;
        pcVar10 = pcVar10 + (long)local_140.
                                  super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start * 0x10;
      } while (pcVar21 !=
               local_140.
               super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
               _M_impl.super__Vector_impl_data._M_start);
    }
  }
  else {
LAB_001a2da7:
    local_1c8[0] = (vector<std::complex<double>,std::allocator<std::complex<double>>>)0x0;
    local_1c0._M_head_impl = (complex<double> *)0x0;
    testing::Message::Message((Message *)local_1f8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_1b0,(internal *)local_1c8,(AssertionResult *)"mat1 == Ytrans","false"
               ,"true",(char *)pcVar28);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_1e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/QGate1.cpp"
               ,0x119,(char *)local_1b0._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_1e0,(Message *)local_1f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_1e0);
    if ((pointer)local_1b0._0_8_ != (pointer)(local_1b0 + 0x10)) {
      operator_delete((void *)local_1b0._0_8_,CONCAT44(local_1b0._20_4_,local_1b0._16_4_) + 1);
    }
    if (local_1f8 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_1f8 + 8))();
    }
    if ((_Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>)
        local_1c0._M_head_impl != (complex<double> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_1c0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_1c0._M_head_impl);
    }
  }
  local_1b0._0_8_ = (AssertHelperData *)0x2;
  local_1b0._8_8_ = operator_new__(0x40);
  *(undefined8 *)((pointer)local_1b0._8_8_)->_M_value = 0x4000000000000000;
  *(undefined8 *)((long)((pointer)local_1b0._8_8_)->_M_value + 8) = 0;
  *(undefined1 **)((pointer)(local_1b0._8_8_ + 0x10))->_M_value = &DAT_4014000000000000;
  *(undefined8 *)(((pointer)(local_1b0._8_8_ + 0x10))->_M_value + 8) = 0;
  *(undefined1 **)((pointer)(local_1b0._8_8_ + 0x20))->_M_value = &DAT_4008000000000000;
  *(undefined8 *)(((pointer)(local_1b0._8_8_ + 0x20))->_M_value + 8) = 0;
  *(undefined1 **)((pointer)(local_1b0._8_8_ + 0x30))->_M_value = &DAT_401c000000000000;
  *(undefined8 *)(((pointer)(local_1b0._8_8_ + 0x30))->_M_value + 8) = 0;
  qclab::dense::SquareMatrix<std::complex<double>_>::operator=
            ((SquareMatrix<std::complex<double>_> *)local_178,
             (SquareMatrix<std::complex<double>_> *)local_1b0);
  if ((pointer)local_1b0._8_8_ != (pointer)0x0) {
    operator_delete__((void *)local_1b0._8_8_);
  }
  pcVar10 = (char *)0x0;
  qclab::qgates::RotationY<std::complex<double>_>::apply
            ((RotationY<std::complex<double>_> *)&local_128,Right,Trans,1,
             (SquareMatrix<std::complex<double>_> *)local_178,0);
  puVar7 = (undefined8 *)operator_new__(0x40);
  *puVar7 = &DAT_4014000000000000;
  puVar7[1] = 0;
  puVar7[2] = 0xc000000000000000;
  puVar7[3] = 0;
  puVar7[4] = &DAT_401c000000000000;
  puVar7[5] = 0;
  puVar7[6] = 0xc008000000000000;
  puVar7[7] = 0;
  if (CONCAT71(local_178._1_7_,local_178[0]) == 2) {
    psVar13 = (size_type *)((long)local_170._M_head_impl + 8);
    puVar12 = puVar7 + 1;
    lVar8 = 0;
    do {
      lVar26 = 0;
      do {
        dVar2 = *(double *)((long)puVar12 + lVar26 + -8);
        pdVar1 = (double *)((long)psVar13 + lVar26 + -8);
        if (((dVar2 != *pdVar1) || (NAN(dVar2) || NAN(*pdVar1))) ||
           ((*(double *)((long)puVar12 + lVar26) != *(double *)((long)psVar13 + lVar26) ||
            (NAN(*(double *)((long)puVar12 + lVar26)) || NAN(*(double *)((long)psVar13 + lVar26)))))
           ) goto LAB_001a2f83;
        lVar26 = lVar26 + 0x10;
      } while (lVar26 != 0x20);
      lVar8 = lVar8 + 1;
      psVar13 = psVar13 + 4;
      puVar12 = puVar12 + 4;
    } while (lVar8 != 2);
  }
  else {
LAB_001a2f83:
    local_1c8[0] = (vector<std::complex<double>,std::allocator<std::complex<double>>>)0x0;
    local_1c0._M_head_impl = (complex<double> *)0x0;
    testing::Message::Message((Message *)local_1f8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_1b0,(internal *)local_1c8,(AssertionResult *)"mat1 == check1","false"
               ,"true",pcVar10);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_1e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/QGate1.cpp"
               ,0x11f,(char *)local_1b0._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_1e0,(Message *)local_1f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_1e0);
    if ((AssertHelperData *)local_1b0._0_8_ != (AssertHelperData *)(local_1b0 + 0x10)) {
      operator_delete((void *)local_1b0._0_8_,CONCAT44(local_1b0._20_4_,local_1b0._16_4_) + 1);
    }
    if (local_1f8 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_1f8 + 8))();
    }
    if ((_Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>)
        local_1c0._M_head_impl != (complex<double> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_1c0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_1c0._M_head_impl);
    }
  }
  qclab::dense::SquareMatrix<std::complex<double>_>::SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)local_1c8,&local_90);
  pcVar10 = (char *)0x0;
  qclab::qgates::RotationY<std::complex<double>_>::apply
            ((RotationY<std::complex<double>_> *)&local_128,Right,Trans,2,
             (SquareMatrix<std::complex<double>_> *)local_1c8,0);
  qclab::dense::kron<std::complex<double>>
            ((dense *)local_1b0,(SquareMatrix<std::complex<double>_> *)&local_140,&local_a0);
  if ((AssertHelperData *)local_1b0._0_8_ ==
      (AssertHelperData *)CONCAT71(local_1c8._1_7_,local_1c8[0])) {
    if (0 < (long)local_1b0._0_8_) {
      psVar13 = (size_type *)((long)local_1c0._M_head_impl + 8);
      puVar11 = (undefined *)(local_1b0._8_8_ + 8);
      pAVar22 = (AssertHelperData *)0x0;
      aVar24 = (allocator_type)0x0;
      do {
        pcVar10 = (char *)0x0;
        pAVar23 = (AssertHelperData *)local_1b0._0_8_;
        do {
          aVar25 = (allocator_type)0x0;
          if (((*(double *)(pcVar10 + (long)(puVar11 + -8)) !=
                *(double *)
                 (pcVar10 +
                 (long)&((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        (psVar13 + -1))->_M_dataplus)) ||
              (aVar25 = aVar24,
              NAN(*(double *)(pcVar10 + (long)(puVar11 + -8))) ||
              NAN(*(double *)
                   (pcVar10 +
                   (long)&((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          (psVar13 + -1))->_M_dataplus)))) ||
             ((*(double *)(pcVar10 + (long)puVar11) != *(double *)((long)psVar13 + (long)pcVar10) ||
              (NAN(*(double *)(pcVar10 + (long)puVar11)) ||
               NAN(*(double *)((long)psVar13 + (long)pcVar10)))))) goto LAB_001a30f9;
          pcVar10 = pcVar10 + 0x10;
          pAVar23 = (AssertHelperData *)((long)&pAVar23[-1].message.field_2 + 0xf);
        } while (pAVar23 != (AssertHelperData *)0x0);
        pAVar22 = (AssertHelperData *)((long)&pAVar22->type + 1);
        psVar13 = psVar13 + local_1b0._0_8_ * 2;
        puVar11 = puVar11 + local_1b0._0_8_ * 0x10;
      } while (pAVar22 != (AssertHelperData *)local_1b0._0_8_);
    }
    aVar25 = (allocator_type)0x1;
  }
  else {
    aVar25 = (allocator_type)0x0;
  }
LAB_001a30f9:
  local_1f8[0] = aVar25;
  local_1f0._M_head_impl = (complex<double> *)0x0;
  if ((_Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>)
      local_1b0._8_8_ != (complex<double> *)0x0) {
    operator_delete__((void *)local_1b0._8_8_);
    aVar25 = local_1f8[0];
  }
  if (((byte)aVar25 & 1) == 0) {
    testing::Message::Message((Message *)local_1e0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_1b0,(internal *)local_1f8,
               (AssertionResult *)"mat2 == qclab::dense::kron( Ytrans , I1 )","false","true",pcVar10
              );
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_190,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/QGate1.cpp"
               ,0x124,(char *)local_1b0._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_190,(Message *)local_1e0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_190);
    if ((AssertHelperData *)local_1b0._0_8_ != (AssertHelperData *)(local_1b0 + 0x10)) {
      operator_delete((void *)local_1b0._0_8_,CONCAT44(local_1b0._20_4_,local_1b0._16_4_) + 1);
    }
    if ((long *)CONCAT71(local_1e0._1_7_,local_1e0[0]) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_1e0._1_7_,local_1e0[0]) + 8))();
    }
  }
  if ((_Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>)
      local_1f0._M_head_impl != (complex<double> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_1f0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_1f0._M_head_impl);
  }
  local_128._M_string_length = CONCAT44(local_128._M_string_length._4_4_,1);
  qclab::dense::SquareMatrix<std::complex<double>_>::operator=
            ((SquareMatrix<std::complex<double>_> *)local_1c8,&local_90);
  pcVar10 = (char *)0x0;
  qclab::qgates::RotationY<std::complex<double>_>::apply
            ((RotationY<std::complex<double>_> *)&local_128,Right,Trans,2,
             (SquareMatrix<std::complex<double>_> *)local_1c8,0);
  qclab::dense::kron<std::complex<double>>
            ((dense *)local_1b0,&local_a0,(SquareMatrix<std::complex<double>_> *)&local_140);
  if ((AssertHelperData *)local_1b0._0_8_ ==
      (AssertHelperData *)CONCAT71(local_1c8._1_7_,local_1c8[0])) {
    if (0 < (long)local_1b0._0_8_) {
      psVar13 = (size_type *)((long)local_1c0._M_head_impl + 8);
      puVar11 = (undefined *)(local_1b0._8_8_ + 8);
      pAVar22 = (AssertHelperData *)0x0;
      aVar24 = (allocator_type)0x0;
      do {
        pcVar10 = (char *)0x0;
        pAVar23 = (AssertHelperData *)local_1b0._0_8_;
        do {
          aVar25 = (allocator_type)0x0;
          if ((((*(double *)(pcVar10 + (long)(puVar11 + -8)) !=
                 *(double *)
                  (pcVar10 +
                  (long)&((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (psVar13 + -1))->_M_dataplus)) ||
               (aVar25 = aVar24,
               NAN(*(double *)(pcVar10 + (long)(puVar11 + -8))) ||
               NAN(*(double *)
                    (pcVar10 +
                    (long)&((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (psVar13 + -1))->_M_dataplus)))) ||
              (*(double *)(pcVar10 + (long)puVar11) != *(double *)((long)psVar13 + (long)pcVar10)))
             || (NAN(*(double *)(pcVar10 + (long)puVar11)) ||
                 NAN(*(double *)((long)psVar13 + (long)pcVar10)))) goto LAB_001a329b;
          pcVar10 = pcVar10 + 0x10;
          pAVar23 = (AssertHelperData *)((long)&pAVar23[-1].message.field_2 + 0xf);
        } while (pAVar23 != (AssertHelperData *)0x0);
        pAVar22 = (AssertHelperData *)((long)&pAVar22->type + 1);
        psVar13 = psVar13 + local_1b0._0_8_ * 2;
        puVar11 = puVar11 + local_1b0._0_8_ * 0x10;
      } while (pAVar22 != (AssertHelperData *)local_1b0._0_8_);
    }
    aVar25 = (allocator_type)0x1;
  }
  else {
    aVar25 = (allocator_type)0x0;
  }
LAB_001a329b:
  local_1f8[0] = aVar25;
  local_1f0._M_head_impl = (complex<double> *)0x0;
  if ((_Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>)
      local_1b0._8_8_ != (complex<double> *)0x0) {
    operator_delete__((void *)local_1b0._8_8_);
    aVar25 = local_1f8[0];
  }
  if (((byte)aVar25 & 1) == 0) {
    testing::Message::Message((Message *)local_1e0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_1b0,(internal *)local_1f8,
               (AssertionResult *)"mat2 == qclab::dense::kron( I1 , Ytrans )","false","true",pcVar10
              );
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_190,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/QGate1.cpp"
               ,0x129,(char *)local_1b0._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_190,(Message *)local_1e0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_190);
    if ((AssertHelperData *)local_1b0._0_8_ != (AssertHelperData *)(local_1b0 + 0x10)) {
      operator_delete((void *)local_1b0._0_8_,CONCAT44(local_1b0._20_4_,local_1b0._16_4_) + 1);
    }
    if ((long *)CONCAT71(local_1e0._1_7_,local_1e0[0]) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_1e0._1_7_,local_1e0[0]) + 8))();
    }
  }
  if ((_Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>)
      local_1f0._M_head_impl != (complex<double> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_1f0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_1f0._M_head_impl);
  }
  qclab::dense::SquareMatrix<std::complex<double>_>::SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)local_1f8,&local_68);
  pAVar22 = (AssertHelperData *)0x0;
  qclab::qgates::RotationY<std::complex<double>_>::apply
            ((RotationY<std::complex<double>_> *)&local_128,Right,Trans,3,
             (SquareMatrix<std::complex<double>_> *)local_1f8,0);
  qclab::dense::kron<std::complex<double>>
            ((dense *)&local_190,(SquareMatrix<std::complex<double>_> *)&local_140,&local_a0);
  qclab::dense::kron<std::complex<double>>
            ((dense *)local_1b0,&local_a0,(SquareMatrix<std::complex<double>_> *)&local_190);
  if ((undefined1  [8])local_1b0._0_8_ == local_1f8) {
    if (0 < (long)local_1b0._0_8_) {
      psVar13 = (size_type *)((long)local_1f0._M_head_impl + 8);
      lVar8 = (long)(void *)local_1b0._8_8_ + 8;
      pAVar23 = (AssertHelperData *)0x0;
      local_1e0[0] = (vector<std::complex<double>,std::allocator<std::complex<double>>>)0x0;
      do {
        lVar26 = 0;
        pAVar22 = (AssertHelperData *)local_1b0._0_8_;
        do {
          dVar2 = *(double *)(lVar8 + lVar26 + -8);
          pdVar1 = (double *)((long)psVar13 + lVar26 + -8);
          if (((dVar2 != *pdVar1) || (NAN(dVar2) || NAN(*pdVar1))) ||
             ((*(double *)(lVar8 + lVar26) != *(double *)((long)psVar13 + lVar26) ||
              (NAN(*(double *)(lVar8 + lVar26)) || NAN(*(double *)((long)psVar13 + lVar26))))))
          goto LAB_001a3444;
          lVar26 = lVar26 + 0x10;
          pAVar22 = (AssertHelperData *)((long)&pAVar22[-1].message.field_2 + 0xf);
        } while (pAVar22 != (AssertHelperData *)0x0);
        pAVar23 = (AssertHelperData *)((long)&pAVar23->type + 1);
        psVar13 = psVar13 + local_1b0._0_8_ * 2;
        lVar8 = lVar8 + local_1b0._0_8_ * 0x10;
      } while (pAVar23 != (AssertHelperData *)local_1b0._0_8_);
    }
    local_1e0[0] = (vector<std::complex<double>,std::allocator<std::complex<double>>>)0x1;
  }
  else {
    local_1e0[0] = (vector<std::complex<double>,std::allocator<std::complex<double>>>)0x0;
  }
LAB_001a3444:
  local_1d8._M_head_impl = (complex<double> *)0x0;
  if ((pointer)local_1b0._8_8_ != (pointer)0x0) {
    operator_delete__((void *)local_1b0._8_8_);
  }
  local_1b0._8_8_ =
       (_Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>)0x0;
  if (local_190.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
      _M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
    operator_delete__(local_190.
                      super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish);
  }
  if (local_1e0[0] == (vector<std::complex<double>,std::allocator<std::complex<double>>>)0x0) {
    testing::Message::Message((Message *)&local_190);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_1b0,(internal *)local_1e0,
               (AssertionResult *)
               "mat3 == qclab::dense::kron( I1 , qclab::dense::kron( Ytrans , I1 ) )","false","true"
               ,(char *)pAVar22);
    testing::internal::AssertHelper::AssertHelper
              (&local_160,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/QGate1.cpp"
               ,0x12f,(char *)local_1b0._0_8_);
    testing::internal::AssertHelper::operator=(&local_160,(Message *)&local_190);
    testing::internal::AssertHelper::~AssertHelper(&local_160);
    if ((AssertHelperData *)local_1b0._0_8_ != (AssertHelperData *)(local_1b0 + 0x10)) {
      operator_delete((void *)local_1b0._0_8_,CONCAT44(local_1b0._20_4_,local_1b0._16_4_) + 1);
    }
    if (local_190.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      (**(code **)(*(long *)(local_190.
                             super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->_M_value + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d8._M_head_impl !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_1d8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_1d8._M_head_impl);
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1f0._M_head_impl !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    operator_delete__(local_1f0._M_head_impl);
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c0._M_head_impl !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    operator_delete__(local_1c0._M_head_impl);
  }
  operator_delete__(puVar7);
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_170._M_head_impl !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    operator_delete__(local_170._M_head_impl);
  }
  if ((tuple<std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>)
      local_140.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      (_Head_base<0UL,_std::complex<double>_*,_false>)0x0) {
    operator_delete__(local_140.
                      super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish);
  }
  if (local_80.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_80.
                    super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_80.
                          super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_80.
                          super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_58.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_58.
                    super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_58.
                          super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.
                          super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_40.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_40.
                    super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_40.
                          super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_40.
                          super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_68.data_._M_t.
      super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>._M_t
      .super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>.
      super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>)0x0) {
    operator_delete__((void *)local_68.data_._M_t.
                              super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                              .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl);
  }
  if ((tuple<std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>)
      local_90.data_._M_t.
      super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>._M_t
      .super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>.
      super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl !=
      (_Head_base<0UL,_std::complex<double>_*,_false>)0x0) {
    operator_delete__((void *)local_90.data_._M_t.
                              super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                              .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl);
  }
  if ((_Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>)
      local_a0.data_._M_t.
      super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>._M_t
      .super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>.
      super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl != (complex<double> *)0x0) {
    operator_delete__((void *)local_a0.data_._M_t.
                              super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                              .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl);
  }
  return;
}

Assistant:

void test_qclab_qgates_QGate1() {

  using R = qclab::real_t< T > ;
  using V = std::vector< T > ;
  using M = qclab::dense::SquareMatrix< T > ;

  const auto I1 = qclab::dense::eye< T >( 2 ) ;
  const auto I2 = qclab::dense::eye< T >( 4 ) ;
  const auto I3 = qclab::dense::eye< T >( 8 ) ;

  const V v1 = { 3 , 5 } ;
  const V v2 = { 3 , 5 , 2 , 7 } ;
  const V v3 = { 3 , 5 , 2 , 7 , 4 , 1 , 8 , 3 } ;

  // apply (NoTrans)
  {
    qclab::qgates::PauliX< T >  X( 0 ) ;

    // nbQubits = 1
    auto vec1 = v1 ;
    X.apply( qclab::Op::NoTrans , 1 , vec1 ) ;
    V check1 = { 5 , 3 } ;
    EXPECT_TRUE( vec1 == check1 ) ;
  #ifdef QCLAB_OMP_OFFLOADING
    vec1 = v1 ; T* vec1_ = vec1.data() ;
    #pragma omp target data map(tofrom:vec1_[0:2])
    { X.apply_device( qclab::Op::NoTrans , 1 , vec1_ ) ; }
    EXPECT_TRUE( vec1 == check1 ) ;
  #endif

    // nbQubits = 2
    auto vec2 = v2 ;
    X.apply( qclab::Op::NoTrans , 2 , vec2 ) ;
    V check2 = { 2 , 7 , 3 , 5 } ;
    EXPECT_TRUE( vec2 == check2 ) ;
  #ifdef QCLAB_OMP_OFFLOADING
    vec2 = v2 ; T* vec2_ = vec2.data() ;
    #pragma omp target data map(tofrom:vec2_[0:4])
    { X.apply_device( qclab::Op::NoTrans , 2 , vec2_ ) ; }
    EXPECT_TRUE( vec2 == check2 ) ;
  #endif

    X.setQubit( 1 ) ;
    vec2 = v2 ;
    X.apply( qclab::Op::NoTrans , 2 , vec2 ) ;
    check2 = { 5 , 3 , 7 , 2 } ;
    EXPECT_TRUE( vec2 == check2 ) ;
  #ifdef QCLAB_OMP_OFFLOADING
    vec2 = v2 ;
    #pragma omp target data map(tofrom:vec2_[0:4])
    { X.apply_device( qclab::Op::NoTrans , 2 , vec2_ ) ; }
    EXPECT_TRUE( vec2 == check2 ) ;
  #endif

    // nbQubits = 3
    auto vec3 = v3 ;
    X.apply( qclab::Op::NoTrans , 3 , vec3 ) ;
    V check3 = { 2 , 7 , 3 , 5 , 8 , 3 , 4 , 1 } ;
    EXPECT_TRUE( vec3 == check3 ) ;
  #ifdef QCLAB_OMP_OFFLOADING
    vec3 = v3 ; T* vec3_ = vec3.data() ;
    #pragma omp target data map(tofrom:vec3_[0:8])
    { X.apply_device( qclab::Op::NoTrans , 3 , vec3_ ) ; }
    EXPECT_TRUE( vec3 == check3 ) ;
  #endif

    X.setQubit( 0 ) ;
    vec3 = v3 ;
    X.apply( qclab::Op::NoTrans , 3 , vec3 ) ;
    check3 = { 4 , 1 , 8 , 3 , 3 , 5 , 2 , 7 } ;
    EXPECT_TRUE( vec3 == check3 ) ;
  #ifdef QCLAB_OMP_OFFLOADING
    vec3 = v3 ;
    #pragma omp target data map(tofrom:vec3_[0:8])
    { X.apply_device( qclab::Op::NoTrans , 3 , vec3_ ) ; }
    EXPECT_TRUE( vec3 == check3 ) ;
  #endif

    X.setQubit( 2 ) ;
    vec3 = v3 ;
    X.apply( qclab::Op::NoTrans , 3 , vec3 ) ;
    check3 = { 5 , 3 , 7 , 2 , 1 , 4 , 3 , 8 } ;
    EXPECT_TRUE( vec3 == check3 ) ;
  #ifdef QCLAB_OMP_OFFLOADING
    vec3 = v3 ;
    #pragma omp target data map(tofrom:vec3_[0:8])
    { X.apply_device( qclab::Op::NoTrans , 3 , vec3_ ) ; }
    EXPECT_TRUE( vec3 == check3 ) ;
  #endif
  }

  // apply (Trans)
  {
    qclab::qgates::RotationY< T >  Y( 0 , R(0) , R(1) ) ;

    // nbQubits = 1
    auto vec1 = v1 ;
    Y.apply( qclab::Op::Trans , 1 , vec1 ) ;
    V check1 = { 5 , -3 } ;
    EXPECT_TRUE( vec1 == check1 ) ;
  #ifdef QCLAB_OMP_OFFLOADING
    vec1 = v1 ; T* vec1_ = vec1.data() ;
    #pragma omp target data map(tofrom:vec1_[0:2])
    { Y.apply_device( qclab::Op::Trans , 1 , vec1_ ) ; }
    EXPECT_TRUE( vec1 == check1 ) ;
  #endif

    // nbQubits = 2
    auto vec2 = v2 ;
    Y.apply( qclab::Op::Trans , 2 , vec2 ) ;
    V check2 = { 2 , 7 , -3 , -5 } ;
    EXPECT_TRUE( vec2 == check2 ) ;
  #ifdef QCLAB_OMP_OFFLOADING
    vec2 = v2 ; T* vec2_ = vec2.data() ;
    #pragma omp target data map(tofrom:vec2_[0:4])
    { Y.apply_device( qclab::Op::Trans , 2 , vec2_ ) ; }
    EXPECT_TRUE( vec2 == check2 ) ;
  #endif

    Y.setQubit( 1 ) ;
    vec2 = v2 ;
    Y.apply( qclab::Op::Trans , 2 , vec2 ) ;
    check2 = { 5 , -3 , 7 , -2 } ;
    EXPECT_TRUE( vec2 == check2 ) ;
  #ifdef QCLAB_OMP_OFFLOADING
    vec2 = v2 ;
    #pragma omp target data map(tofrom:vec2_[0:4])
    { Y.apply_device( qclab::Op::Trans , 2 , vec2_ ) ; }
    EXPECT_TRUE( vec2 == check2 ) ;
  #endif

    // nbQubits = 3
    auto vec3 = v3 ;
    Y.apply( qclab::Op::Trans , 3 , vec3 ) ;
    V check3 = { 2 , 7 , -3 , -5 , 8 , 3 , -4 , -1 } ;
    EXPECT_TRUE( vec3 == check3 ) ;
  #ifdef QCLAB_OMP_OFFLOADING
    vec3 = v3 ; T* vec3_ = vec3.data() ;
    #pragma omp target data map(tofrom:vec3_[0:8])
    { Y.apply_device( qclab::Op::Trans , 3 , vec3_ ) ; }
    EXPECT_TRUE( vec3 == check3 ) ;
  #endif

    Y.setQubit( 0 ) ;
    vec3 = v3 ;
    Y.apply( qclab::Op::Trans , 3 , vec3 ) ;
    check3 = { 4 , 1 , 8 , 3 , -3 , -5 , -2 , -7 } ;
    EXPECT_TRUE( vec3 == check3 ) ;
  #ifdef QCLAB_OMP_OFFLOADING
    vec3 = v3 ;
    #pragma omp target data map(tofrom:vec3_[0:8])
    { Y.apply_device( qclab::Op::Trans , 3 , vec3_ ) ; }
    EXPECT_TRUE( vec3 == check3 ) ;
  #endif

    Y.setQubit( 2 ) ;
    vec3 = v3 ;
    Y.apply( qclab::Op::Trans , 3 , vec3 ) ;
    check3 = { 5 , -3 , 7 , -2 , 1 , -4 , 3 , -8 } ;
    EXPECT_TRUE( vec3 == check3 ) ;
  #ifdef QCLAB_OMP_OFFLOADING
    vec3 = v3 ;
    #pragma omp target data map(tofrom:vec3_[0:8])
    { Y.apply_device( qclab::Op::Trans , 3 , vec3_ ) ; }
    EXPECT_TRUE( vec3 == check3 ) ;
  #endif
  }


  // apply (Left + NoTrans)
  {
    qclab::qgates::PauliX< T >  X( 0 ) ;

    // nbQubits = 1
    auto mat1 = I1 ;
    X.apply( qclab::Side::Left , qclab::Op::NoTrans , 1 , mat1 ) ;
    EXPECT_TRUE( mat1 == X.matrix() ) ;
    mat1 = M( 2 , 3 ,
              5 , 7 ) ;
    X.apply( qclab::Side::Left , qclab::Op::NoTrans , 1 , mat1 ) ;
    M check1( 3 , 2 ,
              7 , 5 ) ;
    EXPECT_TRUE( mat1 == check1 ) ;

    // nbQubits = 2
    auto mat2 = I2 ;
    X.apply( qclab::Side::Left , qclab::Op::NoTrans , 2 , mat2 ) ;
    EXPECT_TRUE( mat2 == qclab::dense::kron( X.matrix() , I1 ) ) ;

    X.setQubit( 1 ) ;
    mat2 = I2 ;
    X.apply( qclab::Side::Left , qclab::Op::NoTrans , 2 , mat2 ) ;
    EXPECT_TRUE( mat2 == qclab::dense::kron( I1 , X.matrix() ) ) ;

    // nbQubits = 3
    auto mat3 = I3 ;
    X.apply( qclab::Side::Left , qclab::Op::NoTrans , 3 , mat3 ) ;
    EXPECT_TRUE( mat3 == qclab::dense::kron( I1 ,
                           qclab::dense::kron( X.matrix() , I1 ) ) ) ;
  }

  // apply (Right + NoTrans)
  {
    qclab::qgates::PauliX< T >  X( 0 ) ;

    // nbQubits = 1
    auto mat1 = I1 ;
    X.apply( qclab::Side::Right , qclab::Op::NoTrans , 1 , mat1 ) ;
    EXPECT_TRUE( mat1 == X.matrix() ) ;
    mat1 = M( 2 , 3 ,
              5 , 7 ) ;
    X.apply( qclab::Side::Right , qclab::Op::NoTrans , 1 , mat1 ) ;
    M check1( 5 , 7 ,
              2 , 3 ) ;
    EXPECT_TRUE( mat1 == check1 ) ;

    // nbQubits = 2
    auto mat2 = I2 ;
    X.apply( qclab::Side::Right , qclab::Op::NoTrans , 2 , mat2 ) ;
    EXPECT_TRUE( mat2 == qclab::dense::kron( X.matrix() , I1 ) ) ;

    X.setQubit( 1 ) ;
    mat2 = I2 ;
    X.apply( qclab::Side::Right , qclab::Op::NoTrans , 2 , mat2 ) ;
    EXPECT_TRUE( mat2 == qclab::dense::kron( I1 , X.matrix() ) ) ;

    // nbQubits = 3
    auto mat3 = I3 ;
    X.apply( qclab::Side::Right , qclab::Op::NoTrans , 3 , mat3 ) ;
    EXPECT_TRUE( mat3 == qclab::dense::kron( I1 ,
                           qclab::dense::kron( X.matrix() , I1 ) ) ) ;
  }

  // apply (Left + Trans)
  {
    qclab::qgates::RotationY< T >  Y( 0 , R(0) , R(1) ) ;
    M Ytrans = qclab::dense::trans( Y.matrix() ) ;

    // nbQubits = 1
    auto mat1 = I1 ;
    Y.apply( qclab::Side::Left , qclab::Op::Trans , 1 , mat1 ) ;
    EXPECT_TRUE( mat1 == Ytrans ) ;
    mat1 = M( 2 , 3 ,
              5 , 7 ) ;
    Y.apply( qclab::Side::Left , qclab::Op::Trans , 1 , mat1 ) ;
    M check1( -3 , 2 ,
              -7 , 5 ) ;
    EXPECT_TRUE( mat1 == check1 ) ;

    // nbQubits = 2
    auto mat2 = I2 ;
    Y.apply( qclab::Side::Left , qclab::Op::Trans , 2 , mat2 ) ;
    EXPECT_TRUE( mat2 == qclab::dense::kron( Ytrans , I1 ) ) ;

    Y.setQubit( 1 ) ;
    mat2 = I2 ;
    Y.apply( qclab::Side::Left , qclab::Op::Trans , 2 , mat2 ) ;
    EXPECT_TRUE( mat2 == qclab::dense::kron( I1 , Ytrans ) ) ;

    // nbQubits = 3
    auto mat3 = I3 ;
    Y.apply( qclab::Side::Left , qclab::Op::Trans , 3 , mat3 ) ;
    EXPECT_TRUE( mat3 == qclab::dense::kron( I1 ,
                           qclab::dense::kron( Ytrans , I1 ) ) ) ;
  }

  // apply (Right + Trans)
  {
    qclab::qgates::RotationY< T >  Y( 0 , R(0) , R(1) ) ;
    M Ytrans = qclab::dense::trans( Y.matrix() ) ;

    // nbQubits = 1
    auto mat1 = I1 ;
    Y.apply( qclab::Side::Right , qclab::Op::Trans , 1 , mat1 ) ;
    EXPECT_TRUE( mat1 == Ytrans ) ;
    mat1 = M( 2 , 3 ,
              5 , 7 ) ;
    Y.apply( qclab::Side::Right , qclab::Op::Trans , 1 , mat1 ) ;
    M check1(  5 ,  7 ,
              -2 , -3 ) ;
    EXPECT_TRUE( mat1 == check1 ) ;

    // nbQubits = 2
    auto mat2 = I2 ;
    Y.apply( qclab::Side::Right , qclab::Op::Trans , 2 , mat2 ) ;
    EXPECT_TRUE( mat2 == qclab::dense::kron( Ytrans , I1 ) ) ;

    Y.setQubit( 1 ) ;
    mat2 = I2 ;
    Y.apply( qclab::Side::Right , qclab::Op::Trans , 2 , mat2 ) ;
    EXPECT_TRUE( mat2 == qclab::dense::kron( I1 , Ytrans ) ) ;

    // nbQubits = 3
    auto mat3 = I3 ;
    Y.apply( qclab::Side::Right , qclab::Op::Trans , 3 , mat3 ) ;
    EXPECT_TRUE( mat3 == qclab::dense::kron( I1 ,
                           qclab::dense::kron( Ytrans , I1 ) ) ) ;
  }

}